

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  int iVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  byte bVar79;
  ulong uVar80;
  uint uVar81;
  long lVar82;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  Geometry *pGVar83;
  long lVar84;
  undefined8 unaff_R13;
  ulong uVar85;
  ulong uVar86;
  uint uVar87;
  byte bVar88;
  ulong uVar89;
  float fVar90;
  float fVar142;
  float fVar144;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar98 [16];
  float fVar143;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar148;
  float fVar149;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar150;
  undefined4 uVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar163;
  float fVar164;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar165 [32];
  float fVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar187;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar188 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [64];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  RTCFilterFunctionNArguments args;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5d0 [16];
  Precalculations *local_5b8;
  Primitive *local_5b0;
  ulong local_5a8;
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [16];
  LinearSpace3fa *local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  int local_410;
  int iStack_40c;
  int iStack_408;
  int iStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar80 = (ulong)(byte)prim[1];
  fVar166 = *(float *)(prim + uVar80 * 0x19 + 0x12);
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar154 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar94 = vsubps_avx(auVar96,*(undefined1 (*) [16])(prim + uVar80 * 0x19 + 6));
  fVar171 = fVar166 * auVar94._0_4_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar80 * 4 + 6);
  auVar104 = vpmovsxbd_avx2(auVar96);
  fVar150 = fVar166 * auVar154._0_4_;
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar80 * 5 + 6);
  auVar102 = vpmovsxbd_avx2(auVar97);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + uVar80 * 6 + 6);
  auVar116 = vpmovsxbd_avx2(auVar152);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar80 * 0xb + 6);
  auVar115 = vpmovsxbd_avx2(auVar8);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar80 * 0xc + 6);
  auVar114 = vpmovsxbd_avx2(auVar9);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar80 * 0xd + 6);
  auVar103 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar80 * 0x12 + 6);
  auVar105 = vpmovsxbd_avx2(auVar11);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar80 * 0x13 + 6);
  auVar113 = vpmovsxbd_avx2(auVar12);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar80 * 0x14 + 6);
  auVar107 = vpmovsxbd_avx2(auVar95);
  auVar106 = vcvtdq2ps_avx(auVar107);
  auVar214._8_4_ = 1;
  auVar214._0_8_ = 0x100000001;
  auVar214._12_4_ = 1;
  auVar214._16_4_ = 1;
  auVar214._20_4_ = 1;
  auVar214._24_4_ = 1;
  auVar214._28_4_ = 1;
  auVar212._4_4_ = fVar150;
  auVar212._0_4_ = fVar150;
  auVar212._8_4_ = fVar150;
  auVar212._12_4_ = fVar150;
  auVar212._16_4_ = fVar150;
  auVar212._20_4_ = fVar150;
  auVar212._24_4_ = fVar150;
  auVar212._28_4_ = fVar150;
  auVar101 = ZEXT1632(CONCAT412(fVar166 * auVar154._12_4_,
                                CONCAT48(fVar166 * auVar154._8_4_,
                                         CONCAT44(fVar166 * auVar154._4_4_,fVar150))));
  auVar108 = vpermps_avx2(auVar214,auVar101);
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar100 = vpermps_avx512vl(auVar99,auVar101);
  fVar150 = auVar100._0_4_;
  auVar193._0_4_ = fVar150 * auVar116._0_4_;
  fVar163 = auVar100._4_4_;
  auVar193._4_4_ = fVar163 * auVar116._4_4_;
  fVar164 = auVar100._8_4_;
  auVar193._8_4_ = fVar164 * auVar116._8_4_;
  fVar173 = auVar100._12_4_;
  auVar193._12_4_ = fVar173 * auVar116._12_4_;
  fVar172 = auVar100._16_4_;
  auVar193._16_4_ = fVar172 * auVar116._16_4_;
  fVar187 = auVar100._20_4_;
  auVar193._20_4_ = fVar187 * auVar116._20_4_;
  fVar90 = auVar100._24_4_;
  auVar193._28_36_ = in_ZMM4._28_36_;
  auVar193._24_4_ = fVar90 * auVar116._24_4_;
  auVar101._4_4_ = auVar103._4_4_ * fVar163;
  auVar101._0_4_ = auVar103._0_4_ * fVar150;
  auVar101._8_4_ = auVar103._8_4_ * fVar164;
  auVar101._12_4_ = auVar103._12_4_ * fVar173;
  auVar101._16_4_ = auVar103._16_4_ * fVar172;
  auVar101._20_4_ = auVar103._20_4_ * fVar187;
  auVar101._24_4_ = auVar103._24_4_ * fVar90;
  auVar101._28_4_ = auVar107._28_4_;
  auVar107._4_4_ = fVar163 * auVar106._4_4_;
  auVar107._0_4_ = fVar150 * auVar106._0_4_;
  auVar107._8_4_ = fVar164 * auVar106._8_4_;
  auVar107._12_4_ = fVar173 * auVar106._12_4_;
  auVar107._16_4_ = fVar172 * auVar106._16_4_;
  auVar107._20_4_ = fVar187 * auVar106._20_4_;
  auVar107._24_4_ = fVar90 * auVar106._24_4_;
  auVar107._28_4_ = auVar100._28_4_;
  auVar96 = vfmadd231ps_fma(auVar193._0_32_,auVar108,auVar102);
  auVar97 = vfmadd231ps_fma(auVar101,auVar108,auVar114);
  auVar152 = vfmadd231ps_fma(auVar107,auVar113,auVar108);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar212,auVar104);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar212,auVar115);
  auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar105,auVar212);
  auVar213._4_4_ = fVar171;
  auVar213._0_4_ = fVar171;
  auVar213._8_4_ = fVar171;
  auVar213._12_4_ = fVar171;
  auVar213._16_4_ = fVar171;
  auVar213._20_4_ = fVar171;
  auVar213._24_4_ = fVar171;
  auVar213._28_4_ = fVar171;
  auVar108 = ZEXT1632(CONCAT412(fVar166 * auVar94._12_4_,
                                CONCAT48(fVar166 * auVar94._8_4_,
                                         CONCAT44(fVar166 * auVar94._4_4_,fVar171))));
  auVar107 = vpermps_avx2(auVar214,auVar108);
  auVar101 = vpermps_avx512vl(auVar99,auVar108);
  fVar166 = auVar101._0_4_;
  fVar150 = auVar101._4_4_;
  auVar108._4_4_ = fVar150 * auVar116._4_4_;
  auVar108._0_4_ = fVar166 * auVar116._0_4_;
  fVar163 = auVar101._8_4_;
  auVar108._8_4_ = fVar163 * auVar116._8_4_;
  fVar164 = auVar101._12_4_;
  auVar108._12_4_ = fVar164 * auVar116._12_4_;
  fVar173 = auVar101._16_4_;
  auVar108._16_4_ = fVar173 * auVar116._16_4_;
  fVar172 = auVar101._20_4_;
  auVar108._20_4_ = fVar172 * auVar116._20_4_;
  fVar187 = auVar101._24_4_;
  auVar108._24_4_ = fVar187 * auVar116._24_4_;
  auVar108._28_4_ = auVar116._28_4_;
  auVar111._0_4_ = fVar166 * auVar103._0_4_;
  auVar111._4_4_ = fVar150 * auVar103._4_4_;
  auVar111._8_4_ = fVar163 * auVar103._8_4_;
  auVar111._12_4_ = fVar164 * auVar103._12_4_;
  auVar111._16_4_ = fVar173 * auVar103._16_4_;
  auVar111._20_4_ = fVar172 * auVar103._20_4_;
  auVar111._24_4_ = fVar187 * auVar103._24_4_;
  auVar111._28_4_ = 0;
  auVar103._4_4_ = fVar150 * auVar106._4_4_;
  auVar103._0_4_ = fVar166 * auVar106._0_4_;
  auVar103._8_4_ = fVar163 * auVar106._8_4_;
  auVar103._12_4_ = fVar164 * auVar106._12_4_;
  auVar103._16_4_ = fVar173 * auVar106._16_4_;
  auVar103._20_4_ = fVar172 * auVar106._20_4_;
  auVar103._24_4_ = fVar187 * auVar106._24_4_;
  auVar103._28_4_ = auVar106._28_4_;
  auVar8 = vfmadd231ps_fma(auVar108,auVar107,auVar102);
  auVar9 = vfmadd231ps_fma(auVar111,auVar107,auVar114);
  auVar10 = vfmadd231ps_fma(auVar103,auVar107,auVar113);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar213,auVar104);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar213,auVar115);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar213,auVar105);
  auVar203._8_4_ = 0x7fffffff;
  auVar203._0_8_ = 0x7fffffff7fffffff;
  auVar203._12_4_ = 0x7fffffff;
  auVar203._16_4_ = 0x7fffffff;
  auVar203._20_4_ = 0x7fffffff;
  auVar203._24_4_ = 0x7fffffff;
  auVar203._28_4_ = 0x7fffffff;
  auVar198._8_4_ = 0x219392ef;
  auVar198._0_8_ = 0x219392ef219392ef;
  auVar198._12_4_ = 0x219392ef;
  auVar198._16_4_ = 0x219392ef;
  auVar198._20_4_ = 0x219392ef;
  auVar198._24_4_ = 0x219392ef;
  auVar198._28_4_ = 0x219392ef;
  auVar104 = vandps_avx(auVar203,ZEXT1632(auVar96));
  uVar85 = vcmpps_avx512vl(auVar104,auVar198,1);
  bVar17 = (bool)((byte)uVar85 & 1);
  auVar99._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar96._0_4_;
  bVar17 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar96._4_4_;
  bVar17 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar96._8_4_;
  bVar17 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar96._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(auVar203,ZEXT1632(auVar97));
  uVar85 = vcmpps_avx512vl(auVar104,auVar198,1);
  bVar17 = (bool)((byte)uVar85 & 1);
  auVar100._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar97._0_4_;
  bVar17 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar97._4_4_;
  bVar17 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar97._8_4_;
  bVar17 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar97._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(auVar203,ZEXT1632(auVar152));
  uVar85 = vcmpps_avx512vl(auVar104,auVar198,1);
  bVar17 = (bool)((byte)uVar85 & 1);
  auVar104._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar152._0_4_;
  bVar17 = (bool)((byte)(uVar85 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar152._4_4_;
  bVar17 = (bool)((byte)(uVar85 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar152._8_4_;
  bVar17 = (bool)((byte)(uVar85 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar152._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar85 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar85 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar85 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar85 >> 7) * 0x219392ef;
  auVar102 = vrcp14ps_avx512vl(auVar99);
  auVar200._8_4_ = 0x3f800000;
  auVar200._0_8_ = 0x3f8000003f800000;
  auVar200._12_4_ = 0x3f800000;
  auVar200._16_4_ = 0x3f800000;
  auVar200._20_4_ = 0x3f800000;
  auVar200._24_4_ = 0x3f800000;
  auVar200._28_4_ = 0x3f800000;
  auVar96 = vfnmadd213ps_fma(auVar99,auVar102,auVar200);
  auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar100);
  auVar97 = vfnmadd213ps_fma(auVar100,auVar102,auVar200);
  auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar104);
  auVar152 = vfnmadd213ps_fma(auVar104,auVar102,auVar200);
  auVar152 = vfmadd132ps_fma(ZEXT1632(auVar152),auVar102,auVar102);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 7 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar8));
  auVar105._4_4_ = auVar96._4_4_ * auVar104._4_4_;
  auVar105._0_4_ = auVar96._0_4_ * auVar104._0_4_;
  auVar105._8_4_ = auVar96._8_4_ * auVar104._8_4_;
  auVar105._12_4_ = auVar96._12_4_ * auVar104._12_4_;
  auVar105._16_4_ = auVar104._16_4_ * 0.0;
  auVar105._20_4_ = auVar104._20_4_ * 0.0;
  auVar105._24_4_ = auVar104._24_4_ * 0.0;
  auVar105._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 9 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar8));
  auVar112._0_4_ = auVar96._0_4_ * auVar104._0_4_;
  auVar112._4_4_ = auVar96._4_4_ * auVar104._4_4_;
  auVar112._8_4_ = auVar96._8_4_ * auVar104._8_4_;
  auVar112._12_4_ = auVar96._12_4_ * auVar104._12_4_;
  auVar112._16_4_ = auVar104._16_4_ * 0.0;
  auVar112._20_4_ = auVar104._20_4_ * 0.0;
  auVar112._24_4_ = auVar104._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 0xe + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar9));
  auVar113._4_4_ = auVar97._4_4_ * auVar104._4_4_;
  auVar113._0_4_ = auVar97._0_4_ * auVar104._0_4_;
  auVar113._8_4_ = auVar97._8_4_ * auVar104._8_4_;
  auVar113._12_4_ = auVar97._12_4_ * auVar104._12_4_;
  auVar113._16_4_ = auVar104._16_4_ * 0.0;
  auVar113._20_4_ = auVar104._20_4_ * 0.0;
  auVar113._24_4_ = auVar104._24_4_ * 0.0;
  auVar113._28_4_ = auVar104._28_4_;
  auVar103 = vpbroadcastd_avx512vl();
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar9));
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 0x15 + 6));
  auVar110._0_4_ = auVar97._0_4_ * auVar104._0_4_;
  auVar110._4_4_ = auVar97._4_4_ * auVar104._4_4_;
  auVar110._8_4_ = auVar97._8_4_ * auVar104._8_4_;
  auVar110._12_4_ = auVar97._12_4_ * auVar104._12_4_;
  auVar110._16_4_ = auVar104._16_4_ * 0.0;
  auVar110._20_4_ = auVar104._20_4_ * 0.0;
  auVar110._24_4_ = auVar104._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar104 = vcvtdq2ps_avx(auVar102);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar10));
  auVar106._4_4_ = auVar104._4_4_ * auVar152._4_4_;
  auVar106._0_4_ = auVar104._0_4_ * auVar152._0_4_;
  auVar106._8_4_ = auVar104._8_4_ * auVar152._8_4_;
  auVar106._12_4_ = auVar104._12_4_ * auVar152._12_4_;
  auVar106._16_4_ = auVar104._16_4_ * 0.0;
  auVar106._20_4_ = auVar104._20_4_ * 0.0;
  auVar106._24_4_ = auVar104._24_4_ * 0.0;
  auVar106._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar80 * 0x17 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar10));
  auVar109._0_4_ = auVar152._0_4_ * auVar104._0_4_;
  auVar109._4_4_ = auVar152._4_4_ * auVar104._4_4_;
  auVar109._8_4_ = auVar152._8_4_ * auVar104._8_4_;
  auVar109._12_4_ = auVar152._12_4_ * auVar104._12_4_;
  auVar109._16_4_ = auVar104._16_4_ * 0.0;
  auVar109._20_4_ = auVar104._20_4_ * 0.0;
  auVar109._24_4_ = auVar104._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar104 = vpminsd_avx2(auVar105,auVar112);
  auVar102 = vpminsd_avx2(auVar113,auVar110);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102 = vpminsd_avx2(auVar106,auVar109);
  uVar151 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar116._4_4_ = uVar151;
  auVar116._0_4_ = uVar151;
  auVar116._8_4_ = uVar151;
  auVar116._12_4_ = uVar151;
  auVar116._16_4_ = uVar151;
  auVar116._20_4_ = uVar151;
  auVar116._24_4_ = uVar151;
  auVar116._28_4_ = uVar151;
  auVar102 = vmaxps_avx512vl(auVar102,auVar116);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102._8_4_ = 0x3f7ffffa;
  auVar102._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar102._12_4_ = 0x3f7ffffa;
  auVar102._16_4_ = 0x3f7ffffa;
  auVar102._20_4_ = 0x3f7ffffa;
  auVar102._24_4_ = 0x3f7ffffa;
  auVar102._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar104,auVar102);
  auVar104 = vpmaxsd_avx2(auVar105,auVar112);
  auVar102 = vpmaxsd_avx2(auVar113,auVar110);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar102 = vpmaxsd_avx2(auVar106,auVar109);
  uVar151 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar115._4_4_ = uVar151;
  auVar115._0_4_ = uVar151;
  auVar115._8_4_ = uVar151;
  auVar115._12_4_ = uVar151;
  auVar115._16_4_ = uVar151;
  auVar115._20_4_ = uVar151;
  auVar115._24_4_ = uVar151;
  auVar115._28_4_ = uVar151;
  auVar102 = vminps_avx512vl(auVar102,auVar115);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar114._8_4_ = 0x3f800003;
  auVar114._0_8_ = 0x3f8000033f800003;
  auVar114._12_4_ = 0x3f800003;
  auVar114._16_4_ = 0x3f800003;
  auVar114._20_4_ = 0x3f800003;
  auVar114._24_4_ = 0x3f800003;
  auVar114._28_4_ = 0x3f800003;
  auVar104 = vmulps_avx512vl(auVar104,auVar114);
  uVar23 = vcmpps_avx512vl(local_80,auVar104,2);
  uVar26 = vpcmpgtd_avx512vl(auVar103,_DAT_01fb4ba0);
  uVar85 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar23 & (byte)uVar26));
  local_548 = pre->ray_space + k;
  local_4d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_5b8 = pre;
  local_5b0 = prim;
  do {
    auVar104 = local_500;
    if (uVar85 == 0) {
      return;
    }
    lVar84 = 0;
    for (uVar80 = uVar85; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      lVar84 = lVar84 + 1;
    }
    uVar13 = *(uint *)(prim + 2);
    uVar87 = *(uint *)(prim + lVar84 * 4 + 6);
    local_5a8 = (ulong)uVar87;
    pGVar83 = (context->scene->geometries).items[uVar13].ptr;
    uVar80 = (ulong)*(uint *)(*(long *)&pGVar83->field_0x58 +
                             pGVar83[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * local_5a8);
    p_Var16 = pGVar83[1].intersectionFilterN;
    lVar84 = *(long *)&pGVar83[1].time_range.upper;
    local_5a0 = *(undefined1 (*) [16])(lVar84 + (long)p_Var16 * uVar80);
    pauVar3 = (undefined1 (*) [16])(lVar84 + (uVar80 + 1) * (long)p_Var16);
    uVar23 = *(undefined8 *)*pauVar3;
    uVar26 = *(undefined8 *)(*pauVar3 + 8);
    auVar12 = *pauVar3;
    auVar10 = *pauVar3;
    auVar8 = *pauVar3;
    auVar96 = *pauVar3;
    pauVar4 = (undefined1 (*) [16])(lVar84 + (uVar80 + 2) * (long)p_Var16);
    uVar73 = *(undefined8 *)*pauVar4;
    uVar74 = *(undefined8 *)(*pauVar4 + 8);
    auVar11 = *pauVar4;
    auVar9 = *pauVar4;
    auVar152 = *pauVar4;
    auVar97 = *pauVar4;
    uVar85 = uVar85 - 1 & uVar85;
    pauVar5 = (undefined1 (*) [12])(lVar84 + (uVar80 + 3) * (long)p_Var16);
    uVar75 = *(undefined8 *)*pauVar5;
    uVar76 = *(undefined8 *)(*pauVar5 + 8);
    local_600 = (float)uVar75;
    fStack_5fc = (float)((ulong)uVar75 >> 0x20);
    fStack_5f8 = (float)uVar76;
    fStack_5f4 = (float)((ulong)uVar76 >> 0x20);
    if (uVar85 != 0) {
      uVar86 = uVar85 - 1 & uVar85;
      for (uVar80 = uVar85; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      }
      if (uVar86 != 0) {
        for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar14 = (int)pGVar83[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar94 = vsubps_avx(local_5a0,auVar95);
    uVar151 = auVar94._0_4_;
    auVar91._4_4_ = uVar151;
    auVar91._0_4_ = uVar151;
    auVar91._8_4_ = uVar151;
    auVar91._12_4_ = uVar151;
    auVar154 = vshufps_avx(auVar94,auVar94,0x55);
    aVar6 = (local_548->vx).field_0;
    aVar7 = (local_548->vy).field_0;
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    fVar166 = (local_548->vz).field_0.m128[0];
    fVar150 = *(float *)((long)&(local_548->vz).field_0 + 4);
    fVar163 = *(float *)((long)&(local_548->vz).field_0 + 8);
    fVar164 = *(float *)((long)&(local_548->vz).field_0 + 0xc);
    auVar202._0_4_ = fVar166 * auVar94._0_4_;
    auVar202._4_4_ = fVar150 * auVar94._4_4_;
    auVar202._8_4_ = fVar163 * auVar94._8_4_;
    auVar202._12_4_ = fVar164 * auVar94._12_4_;
    auVar154 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar7,auVar154);
    auVar202 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar6,auVar91);
    auVar154 = vshufps_avx(local_5a0,local_5a0,0xff);
    auVar91 = vsubps_avx512vl(auVar96,auVar95);
    uVar151 = auVar91._0_4_;
    auVar174._4_4_ = uVar151;
    auVar174._0_4_ = uVar151;
    auVar174._8_4_ = uVar151;
    auVar174._12_4_ = uVar151;
    auVar94 = vshufps_avx(auVar91,auVar91,0x55);
    auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
    auVar92._0_4_ = fVar166 * auVar91._0_4_;
    auVar92._4_4_ = fVar150 * auVar91._4_4_;
    auVar92._8_4_ = fVar163 * auVar91._8_4_;
    auVar92._12_4_ = fVar164 * auVar91._12_4_;
    auVar94 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar7,auVar94);
    auVar174 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar6,auVar174);
    auVar92 = vshufps_avx512vl(auVar96,auVar96,0xff);
    auVar91 = vsubps_avx512vl(auVar97,auVar95);
    uVar151 = auVar91._0_4_;
    auVar93._4_4_ = uVar151;
    auVar93._0_4_ = uVar151;
    auVar93._8_4_ = uVar151;
    auVar93._12_4_ = uVar151;
    auVar94 = vshufps_avx(auVar91,auVar91,0x55);
    auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
    auVar207._0_4_ = fVar166 * auVar91._0_4_;
    auVar207._4_4_ = fVar150 * auVar91._4_4_;
    auVar207._8_4_ = fVar163 * auVar91._8_4_;
    auVar207._12_4_ = fVar164 * auVar91._12_4_;
    auVar94 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar7,auVar94);
    auVar91 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar6,auVar93);
    auVar93 = vshufps_avx512vl(auVar97,auVar97,0xff);
    auVar28._12_4_ = fStack_5f4;
    auVar28._0_12_ = *pauVar5;
    auVar94 = vsubps_avx512vl(auVar28,auVar95);
    uVar151 = auVar94._0_4_;
    auVar175._4_4_ = uVar151;
    auVar175._0_4_ = uVar151;
    auVar175._8_4_ = uVar151;
    auVar175._12_4_ = uVar151;
    auVar95 = vshufps_avx(auVar94,auVar94,0x55);
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar211._0_4_ = fVar166 * auVar94._0_4_;
    auVar211._4_4_ = fVar150 * auVar94._4_4_;
    auVar211._8_4_ = fVar163 * auVar94._8_4_;
    auVar211._12_4_ = fVar164 * auVar94._12_4_;
    auVar95 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar7,auVar95);
    auVar94 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar6,auVar175);
    auVar95 = vshufps_avx512vl(auVar28,auVar28,0xff);
    lVar84 = (long)iVar14 * 0x44;
    auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar84);
    uVar151 = auVar202._0_4_;
    local_2a0._4_4_ = uVar151;
    local_2a0._0_4_ = uVar151;
    local_2a0._8_4_ = uVar151;
    local_2a0._12_4_ = uVar151;
    local_2a0._16_4_ = uVar151;
    local_2a0._20_4_ = uVar151;
    local_2a0._24_4_ = uVar151;
    local_2a0._28_4_ = uVar151;
    auVar188._8_4_ = 1;
    auVar188._0_8_ = 0x100000001;
    auVar188._12_4_ = 1;
    auVar188._16_4_ = 1;
    auVar188._20_4_ = 1;
    auVar188._24_4_ = 1;
    auVar188._28_4_ = 1;
    local_2c0 = vpermps_avx2(auVar188,ZEXT1632(auVar202));
    local_a0 = vbroadcastsd_avx512vl(auVar154);
    auVar116 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar84 + 0x484);
    uVar151 = auVar174._0_4_;
    auVar98._4_4_ = uVar151;
    auVar98._0_4_ = uVar151;
    auVar98._8_4_ = uVar151;
    auVar98._12_4_ = uVar151;
    local_2e0._16_4_ = uVar151;
    local_2e0._0_16_ = auVar98;
    local_2e0._20_4_ = uVar151;
    local_2e0._24_4_ = uVar151;
    local_2e0._28_4_ = uVar151;
    local_300 = vpermps_avx512vl(auVar188,ZEXT1632(auVar174));
    local_c0 = vbroadcastsd_avx512vl(auVar92);
    auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar84 + 0x908);
    uVar151 = auVar91._0_4_;
    local_320._4_4_ = uVar151;
    local_320._0_4_ = uVar151;
    local_320._8_4_ = uVar151;
    local_320._12_4_ = uVar151;
    local_320._16_4_ = uVar151;
    local_320._20_4_ = uVar151;
    local_320._24_4_ = uVar151;
    local_320._28_4_ = uVar151;
    local_340 = vpermps_avx512vl(auVar188,ZEXT1632(auVar91));
    local_e0 = vbroadcastsd_avx512vl(auVar93);
    auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar84 + 0xd8c);
    fVar150 = auVar94._0_4_;
    local_360._4_4_ = fVar150;
    local_360._0_4_ = fVar150;
    fStack_358 = fVar150;
    fStack_354 = fVar150;
    fStack_350 = fVar150;
    fStack_34c = fVar150;
    fStack_348 = fVar150;
    register0x0000139c = fVar150;
    _local_380 = vpermps_avx512vl(auVar188,ZEXT1632(auVar94));
    local_100 = vbroadcastsd_avx512vl(auVar95);
    auVar103 = vmulps_avx512vl(_local_360,auVar114);
    auVar105 = vmulps_avx512vl(_local_380,auVar114);
    auVar95 = vfmadd231ps_fma(auVar103,auVar115,local_320);
    auVar103 = vfmadd231ps_avx512vl(auVar105,auVar115,local_340);
    auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar116,local_2e0);
    auVar106 = vfmadd231ps_avx512vl(auVar103,auVar116,local_300);
    auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar102,local_2a0);
    auVar199 = ZEXT3264(auVar107);
    auVar103 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar84);
    auVar105 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar84 + 0x484);
    auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar84 + 0x908);
    auVar108 = vfmadd231ps_avx512vl(auVar106,auVar102,local_2c0);
    auVar193 = ZEXT3264(auVar108);
    auVar106 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar84 + 0xd8c);
    auVar101 = vmulps_avx512vl(_local_360,auVar106);
    auVar99 = vmulps_avx512vl(_local_380,auVar106);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar113,local_320);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar113,local_340);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,local_2e0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar105,local_300);
    auVar154 = vfmadd231ps_fma(auVar101,auVar103,local_2a0);
    auVar201 = ZEXT1664(auVar154);
    auVar92 = vfmadd231ps_fma(auVar99,auVar103,local_2c0);
    auVar101 = vsubps_avx512vl(ZEXT1632(auVar154),auVar107);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar92),auVar108);
    auVar100 = vmulps_avx512vl(auVar108,auVar101);
    auVar109 = vmulps_avx512vl(auVar107,auVar99);
    auVar100 = vsubps_avx512vl(auVar100,auVar109);
    auVar109 = vmulps_avx512vl(local_100,auVar114);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar115,local_e0);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar116,local_c0);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar102,local_a0);
    auVar110 = vmulps_avx512vl(local_100,auVar106);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar113,local_e0);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar105,local_c0);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar103,local_a0);
    auVar111 = vmulps_avx512vl(auVar99,auVar99);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar101,auVar101);
    auVar112 = vmaxps_avx512vl(auVar109,auVar110);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar112,auVar111);
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    uVar24 = vcmpps_avx512vl(auVar100,auVar111,2);
    auVar95 = vblendps_avx(auVar202,local_5a0,8);
    auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar95 = vandps_avx512vl(auVar95,auVar93);
    auVar96 = vblendps_avx(auVar174,auVar96,8);
    auVar96 = vandps_avx512vl(auVar96,auVar93);
    auVar95 = vmaxps_avx(auVar95,auVar96);
    auVar96 = vblendps_avx(auVar91,auVar97,8);
    auVar97 = vandps_avx512vl(auVar96,auVar93);
    auVar96 = vblendps_avx(auVar94,auVar28,8);
    auVar96 = vandps_avx512vl(auVar96,auVar93);
    auVar96 = vmaxps_avx(auVar97,auVar96);
    auVar96 = vmaxps_avx(auVar95,auVar96);
    auVar97 = vmovshdup_avx(auVar96);
    auVar97 = vmaxss_avx(auVar97,auVar96);
    auVar96 = vshufpd_avx(auVar96,auVar96,1);
    auVar96 = vmaxss_avx(auVar96,auVar97);
    auVar209._0_4_ = (float)iVar14;
    local_500._4_12_ = auVar202._4_12_;
    local_500._0_4_ = auVar209._0_4_;
    local_500._16_16_ = auVar104._16_16_;
    auVar209._4_4_ = auVar209._0_4_;
    auVar209._8_4_ = auVar209._0_4_;
    auVar209._12_4_ = auVar209._0_4_;
    auVar209._16_4_ = auVar209._0_4_;
    auVar209._20_4_ = auVar209._0_4_;
    auVar209._24_4_ = auVar209._0_4_;
    auVar209._28_4_ = auVar209._0_4_;
    uVar25 = vcmpps_avx512vl(auVar209,_DAT_01f7b060,0xe);
    bVar88 = (byte)uVar24 & (byte)uVar25;
    fVar166 = auVar96._0_4_ * 4.7683716e-07;
    local_560 = ZEXT416((uint)fVar166);
    auVar183._8_4_ = 2;
    auVar183._0_8_ = 0x200000002;
    auVar183._12_4_ = 2;
    auVar183._16_4_ = 2;
    auVar183._20_4_ = 2;
    auVar183._24_4_ = 2;
    auVar183._28_4_ = 2;
    local_480 = vpermps_avx512vl(auVar183,ZEXT1632(auVar202));
    auVar217 = ZEXT3264(local_480);
    local_4a0 = vpermps_avx512vl(auVar183,ZEXT1632(auVar174));
    auVar219 = ZEXT3264(local_4a0);
    auVar104 = vpermps_avx512vl(auVar183,ZEXT1632(auVar91));
    local_160 = vpermps_avx2(auVar183,ZEXT1632(auVar94));
    local_440 = *(undefined4 *)(ray + k * 4 + 0x30);
    uStack_43c = 0;
    uStack_438 = 0;
    uStack_434 = 0;
    local_4b0 = vpbroadcastd_avx512vl();
    local_4c0 = vpbroadcastd_avx512vl();
    if (bVar88 != 0) {
      auVar106 = vmulps_avx512vl(local_160,auVar106);
      auVar113 = vfmadd213ps_avx512vl(auVar113,auVar104,auVar106);
      auVar105 = vfmadd213ps_avx512vl(auVar105,local_4a0,auVar113);
      auVar105 = vfmadd213ps_avx512vl(auVar103,local_480,auVar105);
      auVar114 = vmulps_avx512vl(local_160,auVar114);
      auVar115 = vfmadd213ps_avx512vl(auVar115,auVar104,auVar114);
      auVar113 = vfmadd213ps_avx512vl(auVar116,local_4a0,auVar115);
      auVar116 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar84 + 0x1210);
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar84 + 0x1694);
      auVar114 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar84 + 0x1b18);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar84 + 0x1f9c);
      auVar113 = vfmadd213ps_avx512vl(auVar102,local_480,auVar113);
      auVar204._0_4_ = fVar150 * auVar103._0_4_;
      auVar204._4_4_ = fVar150 * auVar103._4_4_;
      auVar204._8_4_ = fVar150 * auVar103._8_4_;
      auVar204._12_4_ = fVar150 * auVar103._12_4_;
      auVar204._16_4_ = fVar150 * auVar103._16_4_;
      auVar204._20_4_ = fVar150 * auVar103._20_4_;
      auVar204._24_4_ = fVar150 * auVar103._24_4_;
      auVar204._28_4_ = 0;
      auVar102 = vmulps_avx512vl(_local_380,auVar103);
      auVar103 = vmulps_avx512vl(local_160,auVar103);
      auVar106 = vfmadd231ps_avx512vl(auVar204,auVar114,local_320);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar114,local_340);
      auVar114 = vfmadd231ps_avx512vl(auVar103,auVar104,auVar114);
      auVar103 = vfmadd231ps_avx512vl(auVar106,auVar115,local_2e0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar115,local_300);
      auVar106 = vfmadd231ps_avx512vl(auVar114,local_4a0,auVar115);
      auVar96 = vfmadd231ps_fma(auVar103,auVar116,local_2a0);
      auVar103 = vfmadd231ps_avx512vl(auVar102,auVar116,local_2c0);
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar84 + 0x1210);
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar84 + 0x1b18);
      auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar84 + 0x1f9c);
      auVar106 = vfmadd231ps_avx512vl(auVar106,local_480,auVar116);
      auVar38._4_4_ = fVar150 * auVar114._4_4_;
      auVar38._0_4_ = fVar150 * auVar114._0_4_;
      auVar38._8_4_ = fVar150 * auVar114._8_4_;
      auVar38._12_4_ = fVar150 * auVar114._12_4_;
      auVar38._16_4_ = fVar150 * auVar114._16_4_;
      auVar38._20_4_ = fVar150 * auVar114._20_4_;
      auVar38._24_4_ = fVar150 * auVar114._24_4_;
      auVar38._28_4_ = auVar116._28_4_;
      auVar116 = vmulps_avx512vl(_local_380,auVar114);
      auVar114 = vmulps_avx512vl(local_160,auVar114);
      auVar100 = vfmadd231ps_avx512vl(auVar38,auVar115,local_320);
      auVar111 = vfmadd231ps_avx512vl(auVar116,auVar115,local_340);
      auVar217 = ZEXT3264(local_480);
      auVar219 = ZEXT3264(local_4a0);
      auVar218 = ZEXT3264(auVar104);
      auVar115 = vfmadd231ps_avx512vl(auVar114,auVar104,auVar115);
      auVar116 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar84 + 0x1694);
      auVar114 = vfmadd231ps_avx512vl(auVar100,auVar116,local_2e0);
      auVar100 = vfmadd231ps_avx512vl(auVar111,auVar116,local_300);
      auVar116 = vfmadd231ps_avx512vl(auVar115,local_4a0,auVar116);
      auVar97 = vfmadd231ps_fma(auVar114,auVar102,local_2a0);
      auVar115 = vfmadd231ps_avx512vl(auVar100,auVar102,local_2c0);
      auVar114 = vfmadd231ps_avx512vl(auVar116,local_480,auVar102);
      auVar215._8_4_ = 0x7fffffff;
      auVar215._0_8_ = 0x7fffffff7fffffff;
      auVar215._12_4_ = 0x7fffffff;
      auVar215._16_4_ = 0x7fffffff;
      auVar215._20_4_ = 0x7fffffff;
      auVar215._24_4_ = 0x7fffffff;
      auVar215._28_4_ = 0x7fffffff;
      auVar102 = vandps_avx(ZEXT1632(auVar96),auVar215);
      auVar116 = vandps_avx(auVar103,auVar215);
      auVar116 = vmaxps_avx(auVar102,auVar116);
      auVar102 = vandps_avx(auVar106,auVar215);
      auVar102 = vmaxps_avx(auVar116,auVar102);
      auVar210._4_4_ = fVar166;
      auVar210._0_4_ = fVar166;
      auVar210._8_4_ = fVar166;
      auVar210._12_4_ = fVar166;
      auVar210._16_4_ = fVar166;
      auVar210._20_4_ = fVar166;
      auVar210._24_4_ = fVar166;
      auVar210._28_4_ = fVar166;
      uVar80 = vcmpps_avx512vl(auVar102,auVar210,1);
      bVar17 = (bool)((byte)uVar80 & 1);
      auVar117._0_4_ = (float)((uint)bVar17 * auVar101._0_4_ | (uint)!bVar17 * auVar96._0_4_);
      bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar117._4_4_ = (float)((uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * auVar96._4_4_);
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar117._8_4_ = (float)((uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * auVar96._8_4_);
      bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar117._12_4_ = (float)((uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * auVar96._12_4_);
      fVar164 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar101._16_4_);
      auVar117._16_4_ = fVar164;
      fVar163 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar101._20_4_);
      auVar117._20_4_ = fVar163;
      fVar150 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar101._24_4_);
      auVar117._24_4_ = fVar150;
      uVar81 = (uint)(byte)(uVar80 >> 7) * auVar101._28_4_;
      auVar117._28_4_ = uVar81;
      bVar17 = (bool)((byte)uVar80 & 1);
      auVar118._0_4_ = (float)((uint)bVar17 * auVar99._0_4_ | (uint)!bVar17 * auVar103._0_4_);
      bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar118._4_4_ = (float)((uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar103._4_4_);
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar118._8_4_ = (float)((uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar103._8_4_);
      bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar118._12_4_ = (float)((uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar103._12_4_);
      bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar118._16_4_ = (float)((uint)bVar17 * auVar99._16_4_ | (uint)!bVar17 * auVar103._16_4_);
      bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar118._20_4_ = (float)((uint)bVar17 * auVar99._20_4_ | (uint)!bVar17 * auVar103._20_4_);
      bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar118._24_4_ = (float)((uint)bVar17 * auVar99._24_4_ | (uint)!bVar17 * auVar103._24_4_);
      bVar17 = SUB81(uVar80 >> 7,0);
      auVar118._28_4_ = (uint)bVar17 * auVar99._28_4_ | (uint)!bVar17 * auVar103._28_4_;
      auVar102 = vandps_avx(auVar215,ZEXT1632(auVar97));
      auVar116 = vandps_avx(auVar115,auVar215);
      auVar116 = vmaxps_avx(auVar102,auVar116);
      auVar102 = vandps_avx(auVar114,auVar215);
      auVar102 = vmaxps_avx(auVar116,auVar102);
      uVar80 = vcmpps_avx512vl(auVar102,auVar210,1);
      bVar17 = (bool)((byte)uVar80 & 1);
      auVar119._0_4_ = (float)((uint)bVar17 * auVar101._0_4_ | (uint)!bVar17 * auVar97._0_4_);
      bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar119._4_4_ = (float)((uint)bVar17 * auVar101._4_4_ | (uint)!bVar17 * auVar97._4_4_);
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar119._8_4_ = (float)((uint)bVar17 * auVar101._8_4_ | (uint)!bVar17 * auVar97._8_4_);
      bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar119._12_4_ = (float)((uint)bVar17 * auVar101._12_4_ | (uint)!bVar17 * auVar97._12_4_);
      fVar187 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar101._16_4_);
      auVar119._16_4_ = fVar187;
      fVar172 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar101._20_4_);
      auVar119._20_4_ = fVar172;
      fVar173 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar101._24_4_);
      auVar119._24_4_ = fVar173;
      auVar119._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar101._28_4_;
      bVar17 = (bool)((byte)uVar80 & 1);
      auVar120._0_4_ = (float)((uint)bVar17 * auVar99._0_4_ | (uint)!bVar17 * auVar115._0_4_);
      bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar120._4_4_ = (float)((uint)bVar17 * auVar99._4_4_ | (uint)!bVar17 * auVar115._4_4_);
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar120._8_4_ = (float)((uint)bVar17 * auVar99._8_4_ | (uint)!bVar17 * auVar115._8_4_);
      bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar120._12_4_ = (float)((uint)bVar17 * auVar99._12_4_ | (uint)!bVar17 * auVar115._12_4_);
      bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar120._16_4_ = (float)((uint)bVar17 * auVar99._16_4_ | (uint)!bVar17 * auVar115._16_4_);
      bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar120._20_4_ = (float)((uint)bVar17 * auVar99._20_4_ | (uint)!bVar17 * auVar115._20_4_);
      bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar120._24_4_ = (float)((uint)bVar17 * auVar99._24_4_ | (uint)!bVar17 * auVar115._24_4_);
      bVar17 = SUB81(uVar80 >> 7,0);
      auVar120._28_4_ = (uint)bVar17 * auVar99._28_4_ | (uint)!bVar17 * auVar115._28_4_;
      auVar98 = vxorps_avx512vl(auVar98,auVar98);
      auVar102 = vfmadd213ps_avx512vl(auVar117,auVar117,ZEXT1632(auVar98));
      auVar96 = vfmadd231ps_fma(auVar102,auVar118,auVar118);
      auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
      fVar90 = auVar102._0_4_;
      fVar171 = auVar102._4_4_;
      fVar142 = auVar102._8_4_;
      fVar143 = auVar102._12_4_;
      fVar144 = auVar102._16_4_;
      fVar145 = auVar102._20_4_;
      fVar146 = auVar102._24_4_;
      auVar39._4_4_ = fVar171 * fVar171 * fVar171 * auVar96._4_4_ * -0.5;
      auVar39._0_4_ = fVar90 * fVar90 * fVar90 * auVar96._0_4_ * -0.5;
      auVar39._8_4_ = fVar142 * fVar142 * fVar142 * auVar96._8_4_ * -0.5;
      auVar39._12_4_ = fVar143 * fVar143 * fVar143 * auVar96._12_4_ * -0.5;
      auVar39._16_4_ = fVar144 * fVar144 * fVar144 * -0.0;
      auVar39._20_4_ = fVar145 * fVar145 * fVar145 * -0.0;
      auVar39._24_4_ = fVar146 * fVar146 * fVar146 * -0.0;
      auVar39._28_4_ = 0;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar115 = vfmadd231ps_avx512vl(auVar39,auVar116,auVar102);
      auVar40._4_4_ = auVar118._4_4_ * auVar115._4_4_;
      auVar40._0_4_ = auVar118._0_4_ * auVar115._0_4_;
      auVar40._8_4_ = auVar118._8_4_ * auVar115._8_4_;
      auVar40._12_4_ = auVar118._12_4_ * auVar115._12_4_;
      auVar40._16_4_ = auVar118._16_4_ * auVar115._16_4_;
      auVar40._20_4_ = auVar118._20_4_ * auVar115._20_4_;
      auVar40._24_4_ = auVar118._24_4_ * auVar115._24_4_;
      auVar40._28_4_ = auVar102._28_4_;
      auVar41._4_4_ = auVar115._4_4_ * -auVar117._4_4_;
      auVar41._0_4_ = auVar115._0_4_ * -auVar117._0_4_;
      auVar41._8_4_ = auVar115._8_4_ * -auVar117._8_4_;
      auVar41._12_4_ = auVar115._12_4_ * -auVar117._12_4_;
      auVar41._16_4_ = auVar115._16_4_ * -fVar164;
      auVar41._20_4_ = auVar115._20_4_ * -fVar163;
      auVar41._24_4_ = auVar115._24_4_ * -fVar150;
      auVar41._28_4_ = uVar81 ^ 0x80000000;
      auVar102 = vmulps_avx512vl(auVar115,ZEXT1632(auVar98));
      auVar106 = ZEXT1632(auVar98);
      auVar114 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar106);
      auVar96 = vfmadd231ps_fma(auVar114,auVar120,auVar120);
      auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
      fVar150 = auVar114._0_4_;
      fVar163 = auVar114._4_4_;
      fVar164 = auVar114._8_4_;
      fVar90 = auVar114._12_4_;
      fVar171 = auVar114._16_4_;
      fVar142 = auVar114._20_4_;
      fVar143 = auVar114._24_4_;
      auVar42._4_4_ = fVar163 * fVar163 * fVar163 * auVar96._4_4_ * -0.5;
      auVar42._0_4_ = fVar150 * fVar150 * fVar150 * auVar96._0_4_ * -0.5;
      auVar42._8_4_ = fVar164 * fVar164 * fVar164 * auVar96._8_4_ * -0.5;
      auVar42._12_4_ = fVar90 * fVar90 * fVar90 * auVar96._12_4_ * -0.5;
      auVar42._16_4_ = fVar171 * fVar171 * fVar171 * -0.0;
      auVar42._20_4_ = fVar142 * fVar142 * fVar142 * -0.0;
      auVar42._24_4_ = fVar143 * fVar143 * fVar143 * -0.0;
      auVar42._28_4_ = 0;
      auVar116 = vfmadd231ps_avx512vl(auVar42,auVar116,auVar114);
      auVar43._4_4_ = auVar120._4_4_ * auVar116._4_4_;
      auVar43._0_4_ = auVar120._0_4_ * auVar116._0_4_;
      auVar43._8_4_ = auVar120._8_4_ * auVar116._8_4_;
      auVar43._12_4_ = auVar120._12_4_ * auVar116._12_4_;
      auVar43._16_4_ = auVar120._16_4_ * auVar116._16_4_;
      auVar43._20_4_ = auVar120._20_4_ * auVar116._20_4_;
      auVar43._24_4_ = auVar120._24_4_ * auVar116._24_4_;
      auVar43._28_4_ = auVar114._28_4_;
      auVar44._4_4_ = -auVar119._4_4_ * auVar116._4_4_;
      auVar44._0_4_ = -auVar119._0_4_ * auVar116._0_4_;
      auVar44._8_4_ = -auVar119._8_4_ * auVar116._8_4_;
      auVar44._12_4_ = -auVar119._12_4_ * auVar116._12_4_;
      auVar44._16_4_ = -fVar187 * auVar116._16_4_;
      auVar44._20_4_ = -fVar172 * auVar116._20_4_;
      auVar44._24_4_ = -fVar173 * auVar116._24_4_;
      auVar44._28_4_ = auVar115._28_4_;
      auVar116 = vmulps_avx512vl(auVar116,auVar106);
      auVar96 = vfmadd213ps_fma(auVar40,auVar109,auVar107);
      auVar97 = vfmadd213ps_fma(auVar41,auVar109,auVar108);
      auVar115 = vfmadd213ps_avx512vl(auVar102,auVar109,auVar113);
      auVar114 = vfmadd213ps_avx512vl(auVar43,auVar110,ZEXT1632(auVar154));
      auVar202 = vfnmadd213ps_fma(auVar40,auVar109,auVar107);
      auVar95 = vfmadd213ps_fma(auVar44,auVar110,ZEXT1632(auVar92));
      auVar174 = vfnmadd213ps_fma(auVar41,auVar109,auVar108);
      auVar94 = vfmadd213ps_fma(auVar116,auVar110,auVar105);
      auVar103 = vfnmadd231ps_avx512vl(auVar113,auVar109,auVar102);
      auVar28 = vfnmadd213ps_fma(auVar43,auVar110,ZEXT1632(auVar154));
      auVar92 = vfnmadd213ps_fma(auVar44,auVar110,ZEXT1632(auVar92));
      auVar93 = vfnmadd231ps_fma(auVar105,auVar110,auVar116);
      auVar116 = vsubps_avx512vl(auVar114,ZEXT1632(auVar202));
      auVar102 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar174));
      auVar105 = vsubps_avx512vl(ZEXT1632(auVar94),auVar103);
      auVar113 = vmulps_avx512vl(auVar102,auVar103);
      auVar154 = vfmsub231ps_fma(auVar113,ZEXT1632(auVar174),auVar105);
      auVar45._4_4_ = auVar202._4_4_ * auVar105._4_4_;
      auVar45._0_4_ = auVar202._0_4_ * auVar105._0_4_;
      auVar45._8_4_ = auVar202._8_4_ * auVar105._8_4_;
      auVar45._12_4_ = auVar202._12_4_ * auVar105._12_4_;
      auVar45._16_4_ = auVar105._16_4_ * 0.0;
      auVar45._20_4_ = auVar105._20_4_ * 0.0;
      auVar45._24_4_ = auVar105._24_4_ * 0.0;
      auVar45._28_4_ = auVar105._28_4_;
      auVar105 = vfmsub231ps_avx512vl(auVar45,auVar103,auVar116);
      auVar46._4_4_ = auVar174._4_4_ * auVar116._4_4_;
      auVar46._0_4_ = auVar174._0_4_ * auVar116._0_4_;
      auVar46._8_4_ = auVar174._8_4_ * auVar116._8_4_;
      auVar46._12_4_ = auVar174._12_4_ * auVar116._12_4_;
      auVar46._16_4_ = auVar116._16_4_ * 0.0;
      auVar46._20_4_ = auVar116._20_4_ * 0.0;
      auVar46._24_4_ = auVar116._24_4_ * 0.0;
      auVar46._28_4_ = auVar116._28_4_;
      auVar91 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar202),auVar102);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar106,auVar105);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,ZEXT1632(auVar154));
      auVar99 = ZEXT1632(auVar98);
      uVar80 = vcmpps_avx512vl(auVar102,auVar99,2);
      bVar79 = (byte)uVar80;
      fVar90 = (float)((uint)(bVar79 & 1) * auVar96._0_4_ |
                      (uint)!(bool)(bVar79 & 1) * auVar28._0_4_);
      bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
      fVar142 = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar28._4_4_);
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      fVar144 = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar28._8_4_);
      bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
      fVar146 = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar28._12_4_);
      auVar113 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar144,CONCAT44(fVar142,fVar90))));
      fVar171 = (float)((uint)(bVar79 & 1) * auVar97._0_4_ |
                       (uint)!(bool)(bVar79 & 1) * auVar92._0_4_);
      bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
      fVar143 = (float)((uint)bVar17 * auVar97._4_4_ | (uint)!bVar17 * auVar92._4_4_);
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      fVar145 = (float)((uint)bVar17 * auVar97._8_4_ | (uint)!bVar17 * auVar92._8_4_);
      bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
      fVar147 = (float)((uint)bVar17 * auVar97._12_4_ | (uint)!bVar17 * auVar92._12_4_);
      auVar106 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar145,CONCAT44(fVar143,fVar171))));
      auVar121._0_4_ =
           (float)((uint)(bVar79 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar93._0_4_);
      bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar121._4_4_ = (float)((uint)bVar17 * auVar115._4_4_ | (uint)!bVar17 * auVar93._4_4_);
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar121._8_4_ = (float)((uint)bVar17 * auVar115._8_4_ | (uint)!bVar17 * auVar93._8_4_);
      bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar121._12_4_ = (float)((uint)bVar17 * auVar115._12_4_ | (uint)!bVar17 * auVar93._12_4_);
      fVar164 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar115._16_4_);
      auVar121._16_4_ = fVar164;
      fVar150 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar115._20_4_);
      auVar121._20_4_ = fVar150;
      fVar163 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar115._24_4_);
      auVar121._24_4_ = fVar163;
      iVar1 = (uint)(byte)(uVar80 >> 7) * auVar115._28_4_;
      auVar121._28_4_ = iVar1;
      auVar116 = vblendmps_avx512vl(ZEXT1632(auVar202),auVar114);
      auVar122._0_4_ =
           (uint)(bVar79 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar97._0_4_;
      bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar17 * auVar116._4_4_ | (uint)!bVar17 * auVar97._4_4_;
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar17 * auVar116._8_4_ | (uint)!bVar17 * auVar97._8_4_;
      bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar17 * auVar116._12_4_ | (uint)!bVar17 * auVar97._12_4_;
      auVar122._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar116._16_4_;
      auVar122._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar116._20_4_;
      auVar122._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar116._24_4_;
      auVar122._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar116._28_4_;
      auVar116 = vblendmps_avx512vl(ZEXT1632(auVar174),ZEXT1632(auVar95));
      auVar123._0_4_ =
           (float)((uint)(bVar79 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar154._0_4_)
      ;
      bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar123._4_4_ = (float)((uint)bVar17 * auVar116._4_4_ | (uint)!bVar17 * auVar154._4_4_);
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar123._8_4_ = (float)((uint)bVar17 * auVar116._8_4_ | (uint)!bVar17 * auVar154._8_4_);
      bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar123._12_4_ = (float)((uint)bVar17 * auVar116._12_4_ | (uint)!bVar17 * auVar154._12_4_);
      fVar173 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar116._16_4_);
      auVar123._16_4_ = fVar173;
      fVar172 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar116._20_4_);
      auVar123._20_4_ = fVar172;
      fVar187 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar116._24_4_);
      auVar123._24_4_ = fVar187;
      auVar123._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar116._28_4_;
      auVar116 = vblendmps_avx512vl(auVar103,ZEXT1632(auVar94));
      auVar124._0_4_ =
           (float)((uint)(bVar79 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar115._0_4_)
      ;
      bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar124._4_4_ = (float)((uint)bVar17 * auVar116._4_4_ | (uint)!bVar17 * auVar115._4_4_);
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar124._8_4_ = (float)((uint)bVar17 * auVar116._8_4_ | (uint)!bVar17 * auVar115._8_4_);
      bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar124._12_4_ = (float)((uint)bVar17 * auVar116._12_4_ | (uint)!bVar17 * auVar115._12_4_);
      bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar124._16_4_ = (float)((uint)bVar17 * auVar116._16_4_ | (uint)!bVar17 * auVar115._16_4_);
      bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar124._20_4_ = (float)((uint)bVar17 * auVar116._20_4_ | (uint)!bVar17 * auVar115._20_4_);
      bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar124._24_4_ = (float)((uint)bVar17 * auVar116._24_4_ | (uint)!bVar17 * auVar115._24_4_);
      bVar17 = SUB81(uVar80 >> 7,0);
      auVar124._28_4_ = (uint)bVar17 * auVar116._28_4_ | (uint)!bVar17 * auVar115._28_4_;
      auVar125._0_4_ =
           (uint)(bVar79 & 1) * (int)auVar202._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar114._0_4_;
      bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar17 * (int)auVar202._4_4_ | (uint)!bVar17 * auVar114._4_4_;
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar17 * (int)auVar202._8_4_ | (uint)!bVar17 * auVar114._8_4_;
      bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar17 * (int)auVar202._12_4_ | (uint)!bVar17 * auVar114._12_4_;
      auVar125._16_4_ = (uint)!(bool)((byte)(uVar80 >> 4) & 1) * auVar114._16_4_;
      auVar125._20_4_ = (uint)!(bool)((byte)(uVar80 >> 5) & 1) * auVar114._20_4_;
      auVar125._24_4_ = (uint)!(bool)((byte)(uVar80 >> 6) & 1) * auVar114._24_4_;
      auVar125._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar114._28_4_;
      bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
      bVar19 = (bool)((byte)(uVar80 >> 2) & 1);
      bVar20 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar126._0_4_ =
           (uint)(bVar79 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar94._0_4_;
      bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar18 * auVar103._4_4_ | (uint)!bVar18 * auVar94._4_4_;
      bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar18 * auVar103._8_4_ | (uint)!bVar18 * auVar94._8_4_;
      bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar18 * auVar103._12_4_ | (uint)!bVar18 * auVar94._12_4_;
      auVar126._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar103._16_4_;
      auVar126._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar103._20_4_;
      auVar126._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar103._24_4_;
      iVar2 = (uint)(byte)(uVar80 >> 7) * auVar103._28_4_;
      auVar126._28_4_ = iVar2;
      auVar107 = vsubps_avx512vl(auVar125,auVar113);
      auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar174._12_4_ |
                                               (uint)!bVar20 * auVar95._12_4_,
                                               CONCAT48((uint)bVar19 * (int)auVar174._8_4_ |
                                                        (uint)!bVar19 * auVar95._8_4_,
                                                        CONCAT44((uint)bVar17 * (int)auVar174._4_4_
                                                                 | (uint)!bVar17 * auVar95._4_4_,
                                                                 (uint)(bVar79 & 1) *
                                                                 (int)auVar174._0_4_ |
                                                                 (uint)!(bool)(bVar79 & 1) *
                                                                 auVar95._0_4_)))),auVar106);
      auVar199 = ZEXT3264(auVar116);
      auVar115 = vsubps_avx(auVar126,auVar121);
      auVar114 = vsubps_avx(auVar113,auVar122);
      auVar201 = ZEXT3264(auVar114);
      auVar103 = vsubps_avx(auVar106,auVar123);
      auVar105 = vsubps_avx(auVar121,auVar124);
      auVar47._4_4_ = auVar115._4_4_ * fVar142;
      auVar47._0_4_ = auVar115._0_4_ * fVar90;
      auVar47._8_4_ = auVar115._8_4_ * fVar144;
      auVar47._12_4_ = auVar115._12_4_ * fVar146;
      auVar47._16_4_ = auVar115._16_4_ * 0.0;
      auVar47._20_4_ = auVar115._20_4_ * 0.0;
      auVar47._24_4_ = auVar115._24_4_ * 0.0;
      auVar47._28_4_ = iVar2;
      auVar96 = vfmsub231ps_fma(auVar47,auVar121,auVar107);
      auVar48._4_4_ = fVar143 * auVar107._4_4_;
      auVar48._0_4_ = fVar171 * auVar107._0_4_;
      auVar48._8_4_ = fVar145 * auVar107._8_4_;
      auVar48._12_4_ = fVar147 * auVar107._12_4_;
      auVar48._16_4_ = auVar107._16_4_ * 0.0;
      auVar48._20_4_ = auVar107._20_4_ * 0.0;
      auVar48._24_4_ = auVar107._24_4_ * 0.0;
      auVar48._28_4_ = auVar102._28_4_;
      auVar97 = vfmsub231ps_fma(auVar48,auVar113,auVar116);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar99,ZEXT1632(auVar96));
      auVar189._0_4_ = auVar116._0_4_ * auVar121._0_4_;
      auVar189._4_4_ = auVar116._4_4_ * auVar121._4_4_;
      auVar189._8_4_ = auVar116._8_4_ * auVar121._8_4_;
      auVar189._12_4_ = auVar116._12_4_ * auVar121._12_4_;
      auVar189._16_4_ = auVar116._16_4_ * fVar164;
      auVar189._20_4_ = auVar116._20_4_ * fVar150;
      auVar189._24_4_ = auVar116._24_4_ * fVar163;
      auVar189._28_4_ = 0;
      auVar96 = vfmsub231ps_fma(auVar189,auVar106,auVar115);
      auVar108 = vfmadd231ps_avx512vl(auVar102,auVar99,ZEXT1632(auVar96));
      auVar102 = vmulps_avx512vl(auVar105,auVar122);
      auVar102 = vfmsub231ps_avx512vl(auVar102,auVar114,auVar124);
      auVar49._4_4_ = auVar103._4_4_ * auVar124._4_4_;
      auVar49._0_4_ = auVar103._0_4_ * auVar124._0_4_;
      auVar49._8_4_ = auVar103._8_4_ * auVar124._8_4_;
      auVar49._12_4_ = auVar103._12_4_ * auVar124._12_4_;
      auVar49._16_4_ = auVar103._16_4_ * auVar124._16_4_;
      auVar49._20_4_ = auVar103._20_4_ * auVar124._20_4_;
      auVar49._24_4_ = auVar103._24_4_ * auVar124._24_4_;
      auVar49._28_4_ = auVar124._28_4_;
      auVar96 = vfmsub231ps_fma(auVar49,auVar123,auVar105);
      auVar190._0_4_ = auVar123._0_4_ * auVar114._0_4_;
      auVar190._4_4_ = auVar123._4_4_ * auVar114._4_4_;
      auVar190._8_4_ = auVar123._8_4_ * auVar114._8_4_;
      auVar190._12_4_ = auVar123._12_4_ * auVar114._12_4_;
      auVar190._16_4_ = fVar173 * auVar114._16_4_;
      auVar190._20_4_ = fVar172 * auVar114._20_4_;
      auVar190._24_4_ = fVar187 * auVar114._24_4_;
      auVar190._28_4_ = 0;
      auVar97 = vfmsub231ps_fma(auVar190,auVar103,auVar122);
      auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar99,auVar102);
      auVar101 = vfmadd231ps_avx512vl(auVar102,auVar99,ZEXT1632(auVar96));
      auVar193 = ZEXT3264(auVar101);
      auVar102 = vmaxps_avx(auVar108,auVar101);
      uVar24 = vcmpps_avx512vl(auVar102,auVar99,2);
      bVar88 = bVar88 & (byte)uVar24;
      if (bVar88 != 0) {
        auVar50._4_4_ = auVar105._4_4_ * auVar116._4_4_;
        auVar50._0_4_ = auVar105._0_4_ * auVar116._0_4_;
        auVar50._8_4_ = auVar105._8_4_ * auVar116._8_4_;
        auVar50._12_4_ = auVar105._12_4_ * auVar116._12_4_;
        auVar50._16_4_ = auVar105._16_4_ * auVar116._16_4_;
        auVar50._20_4_ = auVar105._20_4_ * auVar116._20_4_;
        auVar50._24_4_ = auVar105._24_4_ * auVar116._24_4_;
        auVar50._28_4_ = auVar102._28_4_;
        auVar154 = vfmsub231ps_fma(auVar50,auVar103,auVar115);
        auVar51._4_4_ = auVar115._4_4_ * auVar114._4_4_;
        auVar51._0_4_ = auVar115._0_4_ * auVar114._0_4_;
        auVar51._8_4_ = auVar115._8_4_ * auVar114._8_4_;
        auVar51._12_4_ = auVar115._12_4_ * auVar114._12_4_;
        auVar51._16_4_ = auVar115._16_4_ * auVar114._16_4_;
        auVar51._20_4_ = auVar115._20_4_ * auVar114._20_4_;
        auVar51._24_4_ = auVar115._24_4_ * auVar114._24_4_;
        auVar51._28_4_ = auVar115._28_4_;
        auVar95 = vfmsub231ps_fma(auVar51,auVar107,auVar105);
        auVar52._4_4_ = auVar103._4_4_ * auVar107._4_4_;
        auVar52._0_4_ = auVar103._0_4_ * auVar107._0_4_;
        auVar52._8_4_ = auVar103._8_4_ * auVar107._8_4_;
        auVar52._12_4_ = auVar103._12_4_ * auVar107._12_4_;
        auVar52._16_4_ = auVar103._16_4_ * auVar107._16_4_;
        auVar52._20_4_ = auVar103._20_4_ * auVar107._20_4_;
        auVar52._24_4_ = auVar103._24_4_ * auVar107._24_4_;
        auVar52._28_4_ = auVar103._28_4_;
        auVar94 = vfmsub231ps_fma(auVar52,auVar114,auVar116);
        auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar95),ZEXT1632(auVar94));
        auVar97 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar154),ZEXT1232(ZEXT412(0)) << 0x20)
        ;
        auVar102 = vrcp14ps_avx512vl(ZEXT1632(auVar97));
        auVar201 = ZEXT3264(auVar102);
        auVar29._8_4_ = 0x3f800000;
        auVar29._0_8_ = 0x3f8000003f800000;
        auVar29._12_4_ = 0x3f800000;
        auVar29._16_4_ = 0x3f800000;
        auVar29._20_4_ = 0x3f800000;
        auVar29._24_4_ = 0x3f800000;
        auVar29._28_4_ = 0x3f800000;
        auVar116 = vfnmadd213ps_avx512vl(auVar102,ZEXT1632(auVar97),auVar29);
        auVar96 = vfmadd132ps_fma(auVar116,auVar102,auVar102);
        auVar199 = ZEXT1664(auVar96);
        auVar53._4_4_ = auVar94._4_4_ * auVar121._4_4_;
        auVar53._0_4_ = auVar94._0_4_ * auVar121._0_4_;
        auVar53._8_4_ = auVar94._8_4_ * auVar121._8_4_;
        auVar53._12_4_ = auVar94._12_4_ * auVar121._12_4_;
        auVar53._16_4_ = fVar164 * 0.0;
        auVar53._20_4_ = fVar150 * 0.0;
        auVar53._24_4_ = fVar163 * 0.0;
        auVar53._28_4_ = iVar1;
        auVar95 = vfmadd231ps_fma(auVar53,auVar106,ZEXT1632(auVar95));
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar113,ZEXT1632(auVar154));
        fVar150 = auVar96._0_4_;
        fVar163 = auVar96._4_4_;
        fVar164 = auVar96._8_4_;
        fVar173 = auVar96._12_4_;
        local_240 = ZEXT1632(CONCAT412(auVar95._12_4_ * fVar173,
                                       CONCAT48(auVar95._8_4_ * fVar164,
                                                CONCAT44(auVar95._4_4_ * fVar163,
                                                         auVar95._0_4_ * fVar150))));
        auVar208 = ZEXT3264(local_240);
        auVar155._4_4_ = local_440;
        auVar155._0_4_ = local_440;
        auVar155._8_4_ = local_440;
        auVar155._12_4_ = local_440;
        auVar155._16_4_ = local_440;
        auVar155._20_4_ = local_440;
        auVar155._24_4_ = local_440;
        auVar155._28_4_ = local_440;
        uVar24 = vcmpps_avx512vl(auVar155,local_240,2);
        uVar151 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar30._4_4_ = uVar151;
        auVar30._0_4_ = uVar151;
        auVar30._8_4_ = uVar151;
        auVar30._12_4_ = uVar151;
        auVar30._16_4_ = uVar151;
        auVar30._20_4_ = uVar151;
        auVar30._24_4_ = uVar151;
        auVar30._28_4_ = uVar151;
        uVar25 = vcmpps_avx512vl(local_240,auVar30,2);
        bVar88 = (byte)uVar24 & (byte)uVar25 & bVar88;
        if (bVar88 != 0) {
          uVar86 = vcmpps_avx512vl(ZEXT1632(auVar97),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar86 = bVar88 & uVar86;
          if ((char)uVar86 != '\0') {
            fVar172 = auVar108._0_4_ * fVar150;
            fVar187 = auVar108._4_4_ * fVar163;
            auVar54._4_4_ = fVar187;
            auVar54._0_4_ = fVar172;
            fVar90 = auVar108._8_4_ * fVar164;
            auVar54._8_4_ = fVar90;
            fVar171 = auVar108._12_4_ * fVar173;
            auVar54._12_4_ = fVar171;
            fVar142 = auVar108._16_4_ * 0.0;
            auVar54._16_4_ = fVar142;
            fVar143 = auVar108._20_4_ * 0.0;
            auVar54._20_4_ = fVar143;
            fVar144 = auVar108._24_4_ * 0.0;
            auVar54._24_4_ = fVar144;
            auVar54._28_4_ = auVar108._28_4_;
            auVar156._8_4_ = 0x3f800000;
            auVar156._0_8_ = 0x3f8000003f800000;
            auVar156._12_4_ = 0x3f800000;
            auVar156._16_4_ = 0x3f800000;
            auVar156._20_4_ = 0x3f800000;
            auVar156._24_4_ = 0x3f800000;
            auVar156._28_4_ = 0x3f800000;
            auVar102 = vsubps_avx(auVar156,auVar54);
            local_280._0_4_ =
                 (float)((uint)(bVar79 & 1) * (int)fVar172 |
                        (uint)!(bool)(bVar79 & 1) * auVar102._0_4_);
            bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar17 * (int)fVar187 | (uint)!bVar17 * auVar102._4_4_);
            bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar17 * (int)fVar90 | (uint)!bVar17 * auVar102._8_4_);
            bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
            local_280._12_4_ =
                 (float)((uint)bVar17 * (int)fVar171 | (uint)!bVar17 * auVar102._12_4_);
            bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
            local_280._16_4_ =
                 (float)((uint)bVar17 * (int)fVar142 | (uint)!bVar17 * auVar102._16_4_);
            bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
            local_280._20_4_ =
                 (float)((uint)bVar17 * (int)fVar143 | (uint)!bVar17 * auVar102._20_4_);
            bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
            local_280._24_4_ =
                 (float)((uint)bVar17 * (int)fVar144 | (uint)!bVar17 * auVar102._24_4_);
            bVar17 = SUB81(uVar80 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar17 * auVar108._28_4_ | (uint)!bVar17 * auVar102._28_4_);
            auVar102 = vsubps_avx(auVar110,auVar109);
            auVar96 = vfmadd213ps_fma(auVar102,local_280,auVar109);
            uVar151 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
            auVar31._4_4_ = uVar151;
            auVar31._0_4_ = uVar151;
            auVar31._8_4_ = uVar151;
            auVar31._12_4_ = uVar151;
            auVar31._16_4_ = uVar151;
            auVar31._20_4_ = uVar151;
            auVar31._24_4_ = uVar151;
            auVar31._28_4_ = uVar151;
            auVar102 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                          CONCAT48(auVar96._8_4_ + auVar96._8_4_,
                                                                   CONCAT44(auVar96._4_4_ +
                                                                            auVar96._4_4_,
                                                                            auVar96._0_4_ +
                                                                            auVar96._0_4_)))),
                                       auVar31);
            uVar89 = vcmpps_avx512vl(local_240,auVar102,6);
            uVar86 = uVar86 & uVar89;
            bVar88 = (byte)uVar86;
            if (bVar88 != 0) {
              auVar169._0_4_ = auVar101._0_4_ * fVar150;
              auVar169._4_4_ = auVar101._4_4_ * fVar163;
              auVar169._8_4_ = auVar101._8_4_ * fVar164;
              auVar169._12_4_ = auVar101._12_4_ * fVar173;
              auVar169._16_4_ = auVar101._16_4_ * 0.0;
              auVar169._20_4_ = auVar101._20_4_ * 0.0;
              auVar169._24_4_ = auVar101._24_4_ * 0.0;
              auVar169._28_4_ = 0;
              auVar184._8_4_ = 0x3f800000;
              auVar184._0_8_ = 0x3f8000003f800000;
              auVar184._12_4_ = 0x3f800000;
              auVar184._16_4_ = 0x3f800000;
              auVar184._20_4_ = 0x3f800000;
              auVar184._24_4_ = 0x3f800000;
              auVar184._28_4_ = 0x3f800000;
              auVar102 = vsubps_avx(auVar184,auVar169);
              auVar127._0_4_ =
                   (uint)(bVar79 & 1) * (int)auVar169._0_4_ |
                   (uint)!(bool)(bVar79 & 1) * auVar102._0_4_;
              bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
              auVar127._4_4_ = (uint)bVar17 * (int)auVar169._4_4_ | (uint)!bVar17 * auVar102._4_4_;
              bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
              auVar127._8_4_ = (uint)bVar17 * (int)auVar169._8_4_ | (uint)!bVar17 * auVar102._8_4_;
              bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
              auVar127._12_4_ =
                   (uint)bVar17 * (int)auVar169._12_4_ | (uint)!bVar17 * auVar102._12_4_;
              bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
              auVar127._16_4_ =
                   (uint)bVar17 * (int)auVar169._16_4_ | (uint)!bVar17 * auVar102._16_4_;
              bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
              auVar127._20_4_ =
                   (uint)bVar17 * (int)auVar169._20_4_ | (uint)!bVar17 * auVar102._20_4_;
              bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
              auVar127._24_4_ =
                   (uint)bVar17 * (int)auVar169._24_4_ | (uint)!bVar17 * auVar102._24_4_;
              auVar127._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar102._28_4_;
              auVar32._8_4_ = 0x40000000;
              auVar32._0_8_ = 0x4000000040000000;
              auVar32._12_4_ = 0x40000000;
              auVar32._16_4_ = 0x40000000;
              auVar32._20_4_ = 0x40000000;
              auVar32._24_4_ = 0x40000000;
              auVar32._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar127,auVar184,auVar32);
              local_220 = 0;
              local_21c = iVar14;
              auVar206 = ZEXT1664(local_5a0);
              local_210 = local_5a0;
              local_200 = uVar23;
              uStack_1f8 = uVar26;
              local_1f0 = uVar73;
              uStack_1e8 = uVar74;
              local_1e0 = uVar75;
              uStack_1d8 = uVar76;
              if ((pGVar83->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar166 = 1.0 / auVar209._0_4_;
                local_1c0[0] = fVar166 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar166 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar166 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar166 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar166 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar166 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar166 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                auVar157._8_4_ = 0x7f800000;
                auVar157._0_8_ = 0x7f8000007f800000;
                auVar157._12_4_ = 0x7f800000;
                auVar157._16_4_ = 0x7f800000;
                auVar157._20_4_ = 0x7f800000;
                auVar157._24_4_ = 0x7f800000;
                auVar157._28_4_ = 0x7f800000;
                auVar102 = vblendmps_avx512vl(auVar157,local_240);
                auVar128._0_4_ =
                     (uint)(bVar88 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar88 & 1) * 0x7f800000;
                bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
                auVar128._4_4_ = (uint)bVar17 * auVar102._4_4_ | (uint)!bVar17 * 0x7f800000;
                bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
                auVar128._8_4_ = (uint)bVar17 * auVar102._8_4_ | (uint)!bVar17 * 0x7f800000;
                bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
                auVar128._12_4_ = (uint)bVar17 * auVar102._12_4_ | (uint)!bVar17 * 0x7f800000;
                bVar17 = (bool)((byte)(uVar86 >> 4) & 1);
                auVar128._16_4_ = (uint)bVar17 * auVar102._16_4_ | (uint)!bVar17 * 0x7f800000;
                bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
                auVar128._20_4_ = (uint)bVar17 * auVar102._20_4_ | (uint)!bVar17 * 0x7f800000;
                bVar17 = (bool)((byte)(uVar86 >> 6) & 1);
                auVar128._24_4_ = (uint)bVar17 * auVar102._24_4_ | (uint)!bVar17 * 0x7f800000;
                bVar17 = SUB81(uVar86 >> 7,0);
                auVar128._28_4_ = (uint)bVar17 * auVar102._28_4_ | (uint)!bVar17 * 0x7f800000;
                auVar102 = vshufps_avx(auVar128,auVar128,0xb1);
                auVar102 = vminps_avx(auVar128,auVar102);
                auVar116 = vshufpd_avx(auVar102,auVar102,5);
                auVar102 = vminps_avx(auVar102,auVar116);
                auVar116 = vpermpd_avx2(auVar102,0x4e);
                auVar102 = vminps_avx(auVar102,auVar116);
                uVar24 = vcmpps_avx512vl(auVar128,auVar102,0);
                uVar81 = (uint)uVar86;
                if ((bVar88 & (byte)uVar24) != 0) {
                  uVar81 = (uint)(bVar88 & (byte)uVar24);
                }
                uVar27 = 0;
                for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
                  uVar27 = uVar27 + 1;
                }
                uVar80 = (ulong)uVar27;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_460 = *(float *)(ray + k * 4 + 0x80);
                  fStack_45c = 0.0;
                  fStack_458 = 0.0;
                  fStack_454 = 0.0;
                  local_540 = auVar104;
                  local_520 = local_240;
                  do {
                    fVar166 = local_1c0[uVar80];
                    local_3e0._4_4_ = fVar166;
                    local_3e0._0_4_ = fVar166;
                    local_3e0._8_4_ = fVar166;
                    local_3e0._12_4_ = fVar166;
                    local_3d0 = *(undefined4 *)(local_1a0 + uVar80 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar80 * 4);
                    local_590.context = context->user;
                    fVar150 = 1.0 - fVar166;
                    auVar154 = vfnmadd231ss_fma(ZEXT416((uint)(fVar166 * (fVar150 + fVar150))),
                                                ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                    auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3e0,
                                              ZEXT416(0xc0a00000));
                    auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166 * 3.0)),
                                              ZEXT416((uint)(fVar166 + fVar166)),auVar96);
                    auVar201 = ZEXT1664(auVar95);
                    auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3e0,
                                              ZEXT416(0x40000000));
                    auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * -3.0)),
                                              ZEXT416((uint)(fVar150 + fVar150)),auVar96);
                    auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),local_3e0,
                                              ZEXT416((uint)(fVar150 * -2.0)));
                    fVar166 = auVar154._0_4_ * 0.5;
                    fVar150 = auVar95._0_4_ * 0.5;
                    fVar163 = auVar96._0_4_ * 0.5;
                    fVar164 = auVar97._0_4_ * 0.5;
                    auVar94._0_4_ = fVar164 * local_600;
                    auVar94._4_4_ = fVar164 * fStack_5fc;
                    auVar94._8_4_ = fVar164 * fStack_5f8;
                    auVar94._12_4_ = fVar164 * fStack_5f4;
                    auVar197._4_4_ = fVar163;
                    auVar197._0_4_ = fVar163;
                    auVar197._8_4_ = fVar163;
                    auVar197._12_4_ = fVar163;
                    auVar96 = vfmadd132ps_fma(auVar197,auVar94,auVar152);
                    auVar199 = ZEXT1664(auVar96);
                    auVar182._4_4_ = fVar150;
                    auVar182._0_4_ = fVar150;
                    auVar182._8_4_ = fVar150;
                    auVar182._12_4_ = fVar150;
                    auVar97 = vfmadd132ps_fma(auVar182,auVar96,auVar8);
                    auVar154._4_4_ = fVar166;
                    auVar154._0_4_ = fVar166;
                    auVar154._8_4_ = fVar166;
                    auVar154._12_4_ = fVar166;
                    auVar97 = vfmadd213ps_fma(auVar154,auVar206._0_16_,auVar97);
                    local_410 = auVar97._0_4_;
                    local_400 = vshufps_avx(auVar97,auVar97,0x55);
                    auVar193 = ZEXT1664(local_400);
                    local_3f0 = vshufps_avx(auVar97,auVar97,0xaa);
                    iStack_40c = local_410;
                    iStack_408 = local_410;
                    iStack_404 = local_410;
                    uStack_3cc = local_3d0;
                    uStack_3c8 = local_3d0;
                    uStack_3c4 = local_3d0;
                    local_3c0 = local_4c0._0_8_;
                    uStack_3b8 = local_4c0._8_8_;
                    local_3b0 = local_4b0;
                    vpcmpeqd_avx2(ZEXT1632(local_4b0),ZEXT1632(local_4b0));
                    uStack_39c = (local_590.context)->instID[0];
                    local_3a0 = uStack_39c;
                    uStack_398 = uStack_39c;
                    uStack_394 = uStack_39c;
                    uStack_390 = (local_590.context)->instPrimID[0];
                    uStack_38c = uStack_390;
                    uStack_388 = uStack_390;
                    uStack_384 = uStack_390;
                    local_5d0 = local_4d0;
                    local_590.valid = (int *)local_5d0;
                    local_590.geometryUserPtr = pGVar83->userPtr;
                    local_590.hit = (RTCHitN *)&local_410;
                    local_590.N = 4;
                    local_590.ray = (RTCRayN *)ray;
                    if (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar193 = ZEXT1664(local_400);
                      auVar199 = ZEXT1664(auVar96);
                      auVar201 = ZEXT1664(auVar95);
                      (*pGVar83->intersectionFilterN)(&local_590);
                      auVar208 = ZEXT3264(local_520);
                      auVar218 = ZEXT3264(local_540);
                      auVar219 = ZEXT3264(local_4a0);
                      auVar217 = ZEXT3264(local_480);
                      auVar206 = ZEXT1664(local_5a0);
                    }
                    uVar89 = vptestmd_avx512vl(local_5d0,local_5d0);
                    if ((uVar89 & 0xf) == 0) {
LAB_01a53af5:
                      *(float *)(ray + k * 4 + 0x80) = local_460;
                    }
                    else {
                      p_Var16 = context->args->filter;
                      if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar83->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar193 = ZEXT1664(auVar193._0_16_);
                        auVar199 = ZEXT1664(auVar199._0_16_);
                        auVar201 = ZEXT1664(auVar201._0_16_);
                        (*p_Var16)(&local_590);
                        auVar208 = ZEXT3264(local_520);
                        auVar218 = ZEXT3264(local_540);
                        auVar219 = ZEXT3264(local_4a0);
                        auVar217 = ZEXT3264(local_480);
                        auVar206 = ZEXT1664(local_5a0);
                      }
                      uVar89 = vptestmd_avx512vl(local_5d0,local_5d0);
                      uVar89 = uVar89 & 0xf;
                      bVar88 = (byte)uVar89;
                      if (bVar88 == 0) goto LAB_01a53af5;
                      iVar1 = *(int *)(local_590.hit + 4);
                      iVar2 = *(int *)(local_590.hit + 8);
                      iVar72 = *(int *)(local_590.hit + 0xc);
                      bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                      bVar19 = SUB81(uVar89 >> 3,0);
                      *(uint *)(local_590.ray + 0xc0) =
                           (uint)(bVar88 & 1) * *(int *)local_590.hit |
                           (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0xc0);
                      *(uint *)(local_590.ray + 0xc4) =
                           (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xc4);
                      *(uint *)(local_590.ray + 200) =
                           (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 200);
                      *(uint *)(local_590.ray + 0xcc) =
                           (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_590.ray + 0xcc);
                      iVar1 = *(int *)(local_590.hit + 0x14);
                      iVar2 = *(int *)(local_590.hit + 0x18);
                      iVar72 = *(int *)(local_590.hit + 0x1c);
                      bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                      bVar19 = SUB81(uVar89 >> 3,0);
                      *(uint *)(local_590.ray + 0xd0) =
                           (uint)(bVar88 & 1) * *(int *)(local_590.hit + 0x10) |
                           (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0xd0);
                      *(uint *)(local_590.ray + 0xd4) =
                           (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xd4);
                      *(uint *)(local_590.ray + 0xd8) =
                           (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xd8);
                      *(uint *)(local_590.ray + 0xdc) =
                           (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_590.ray + 0xdc);
                      iVar1 = *(int *)(local_590.hit + 0x24);
                      iVar2 = *(int *)(local_590.hit + 0x28);
                      iVar72 = *(int *)(local_590.hit + 0x2c);
                      bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                      bVar19 = SUB81(uVar89 >> 3,0);
                      *(uint *)(local_590.ray + 0xe0) =
                           (uint)(bVar88 & 1) * *(int *)(local_590.hit + 0x20) |
                           (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0xe0);
                      *(uint *)(local_590.ray + 0xe4) =
                           (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xe4);
                      *(uint *)(local_590.ray + 0xe8) =
                           (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xe8);
                      *(uint *)(local_590.ray + 0xec) =
                           (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_590.ray + 0xec);
                      iVar1 = *(int *)(local_590.hit + 0x34);
                      iVar2 = *(int *)(local_590.hit + 0x38);
                      iVar72 = *(int *)(local_590.hit + 0x3c);
                      bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                      bVar19 = SUB81(uVar89 >> 3,0);
                      *(uint *)(local_590.ray + 0xf0) =
                           (uint)(bVar88 & 1) * *(int *)(local_590.hit + 0x30) |
                           (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0xf0);
                      *(uint *)(local_590.ray + 0xf4) =
                           (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xf4);
                      *(uint *)(local_590.ray + 0xf8) =
                           (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xf8);
                      *(uint *)(local_590.ray + 0xfc) =
                           (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_590.ray + 0xfc);
                      iVar1 = *(int *)(local_590.hit + 0x44);
                      iVar2 = *(int *)(local_590.hit + 0x48);
                      iVar72 = *(int *)(local_590.hit + 0x4c);
                      bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                      bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                      bVar19 = SUB81(uVar89 >> 3,0);
                      *(uint *)(local_590.ray + 0x100) =
                           (uint)(bVar88 & 1) * *(int *)(local_590.hit + 0x40) |
                           (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0x100);
                      *(uint *)(local_590.ray + 0x104) =
                           (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0x104);
                      *(uint *)(local_590.ray + 0x108) =
                           (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0x108);
                      *(uint *)(local_590.ray + 0x10c) =
                           (uint)bVar19 * iVar72 | (uint)!bVar19 * *(int *)(local_590.ray + 0x10c);
                      auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50));
                      *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar96;
                      auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60));
                      *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar96;
                      auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70));
                      *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar96;
                      auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80));
                      *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar96;
                      local_460 = *(float *)(ray + k * 4 + 0x80);
                      fStack_45c = 0.0;
                      fStack_458 = 0.0;
                      fStack_454 = 0.0;
                    }
                    auVar104 = auVar218._0_32_;
                    bVar88 = ~(byte)(1 << ((uint)uVar80 & 0x1f)) & (byte)uVar86;
                    auVar161._4_4_ = local_460;
                    auVar161._0_4_ = local_460;
                    auVar161._8_4_ = local_460;
                    auVar161._12_4_ = local_460;
                    auVar161._16_4_ = local_460;
                    auVar161._20_4_ = local_460;
                    auVar161._24_4_ = local_460;
                    auVar161._28_4_ = local_460;
                    uVar24 = vcmpps_avx512vl(auVar208._0_32_,auVar161,2);
                    if ((bVar88 & (byte)uVar24) == 0) goto LAB_01a529ec;
                    bVar88 = bVar88 & (byte)uVar24;
                    uVar86 = (ulong)bVar88;
                    auVar162._8_4_ = 0x7f800000;
                    auVar162._0_8_ = 0x7f8000007f800000;
                    auVar162._12_4_ = 0x7f800000;
                    auVar162._16_4_ = 0x7f800000;
                    auVar162._20_4_ = 0x7f800000;
                    auVar162._24_4_ = 0x7f800000;
                    auVar162._28_4_ = 0x7f800000;
                    auVar104 = vblendmps_avx512vl(auVar162,auVar208._0_32_);
                    auVar141._0_4_ =
                         (uint)(bVar88 & 1) * auVar104._0_4_ |
                         (uint)!(bool)(bVar88 & 1) * 0x7f800000;
                    bVar17 = (bool)(bVar88 >> 1 & 1);
                    auVar141._4_4_ = (uint)bVar17 * auVar104._4_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar88 >> 2 & 1);
                    auVar141._8_4_ = (uint)bVar17 * auVar104._8_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar88 >> 3 & 1);
                    auVar141._12_4_ = (uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar88 >> 4 & 1);
                    auVar141._16_4_ = (uint)bVar17 * auVar104._16_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar88 >> 5 & 1);
                    auVar141._20_4_ = (uint)bVar17 * auVar104._20_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)(bVar88 >> 6 & 1);
                    auVar141._24_4_ = (uint)bVar17 * auVar104._24_4_ | (uint)!bVar17 * 0x7f800000;
                    auVar141._28_4_ =
                         (uint)(bVar88 >> 7) * auVar104._28_4_ |
                         (uint)!(bool)(bVar88 >> 7) * 0x7f800000;
                    auVar104 = vshufps_avx(auVar141,auVar141,0xb1);
                    auVar104 = vminps_avx(auVar141,auVar104);
                    auVar102 = vshufpd_avx(auVar104,auVar104,5);
                    auVar104 = vminps_avx(auVar104,auVar102);
                    auVar102 = vpermpd_avx2(auVar104,0x4e);
                    auVar104 = vminps_avx(auVar104,auVar102);
                    uVar24 = vcmpps_avx512vl(auVar141,auVar104,0);
                    bVar79 = (byte)uVar24 & bVar88;
                    if (bVar79 != 0) {
                      bVar88 = bVar79;
                    }
                    uVar87 = 0;
                    for (uVar81 = (uint)bVar88; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000
                        ) {
                      uVar87 = uVar87 + 1;
                    }
                    uVar80 = (ulong)uVar87;
                  } while( true );
                }
                fVar166 = local_1c0[uVar80];
                uVar151 = *(undefined4 *)(local_1a0 + uVar80 * 4);
                fVar150 = 1.0 - fVar166;
                auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar166 * (fVar150 + fVar150))),
                                          ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                auVar152 = ZEXT416((uint)fVar166);
                auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar152,
                                          ZEXT416(0xc0a00000));
                auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166 * 3.0)),
                                          ZEXT416((uint)(fVar166 + fVar166)),auVar96);
                auVar201 = ZEXT1664(auVar97);
                auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar152,
                                          ZEXT416(0x40000000));
                auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * -3.0)),
                                          ZEXT416((uint)(fVar150 + fVar150)),auVar96);
                auVar152 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),auVar152,
                                           ZEXT416((uint)(fVar150 * -2.0)));
                fVar150 = auVar8._0_4_ * 0.5;
                fVar163 = auVar97._0_4_ * 0.5;
                auVar193 = ZEXT464((uint)fVar163);
                fVar164 = auVar96._0_4_ * 0.5;
                fVar173 = auVar152._0_4_ * 0.5;
                auVar176._0_4_ = fVar173 * local_600;
                auVar176._4_4_ = fVar173 * fStack_5fc;
                auVar176._8_4_ = fVar173 * fStack_5f8;
                auVar176._12_4_ = fVar173 * fStack_5f4;
                auVar194._4_4_ = fVar164;
                auVar194._0_4_ = fVar164;
                auVar194._8_4_ = fVar164;
                auVar194._12_4_ = fVar164;
                auVar96 = vfmadd132ps_fma(auVar194,auVar176,*pauVar4);
                auVar199 = ZEXT1664(auVar96);
                auVar177._4_4_ = fVar163;
                auVar177._0_4_ = fVar163;
                auVar177._8_4_ = fVar163;
                auVar177._12_4_ = fVar163;
                auVar96 = vfmadd132ps_fma(auVar177,auVar96,*pauVar3);
                auVar167._4_4_ = fVar150;
                auVar167._0_4_ = fVar150;
                auVar167._8_4_ = fVar150;
                auVar167._12_4_ = fVar150;
                auVar96 = vfmadd213ps_fma(auVar167,local_5a0,auVar96);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar80 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar96._0_4_;
                uVar15 = vextractps_avx(auVar96,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar15;
                uVar15 = vextractps_avx(auVar96,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar15;
                *(float *)(ray + k * 4 + 0xf0) = fVar166;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar151;
                *(uint *)(ray + k * 4 + 0x110) = uVar87;
                *(uint *)(ray + k * 4 + 0x120) = uVar13;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
LAB_01a529ec:
                pre = local_5b8;
                prim = local_5b0;
                fVar166 = (float)local_560._0_4_;
              }
            }
          }
        }
      }
    }
    local_560._0_4_ = fVar166;
    if (8 < iVar14) {
      auVar102 = vpbroadcastd_avx512vl();
      auVar218 = ZEXT3264(auVar102);
      local_460 = (float)local_560._0_4_;
      fStack_45c = (float)local_560._0_4_;
      fStack_458 = (float)local_560._0_4_;
      fStack_454 = (float)local_560._0_4_;
      fStack_450 = (float)local_560._0_4_;
      fStack_44c = (float)local_560._0_4_;
      fStack_448 = (float)local_560._0_4_;
      fStack_444 = (float)local_560._0_4_;
      uStack_43c = local_440;
      uStack_438 = local_440;
      uStack_434 = local_440;
      uStack_430 = local_440;
      uStack_42c = local_440;
      uStack_428 = local_440;
      uStack_424 = local_440;
      local_120 = 1.0 / (float)local_500._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      lVar82 = 8;
      local_540 = auVar104;
LAB_01a52a8c:
      if (lVar82 < iVar14) {
        auVar104 = vpbroadcastd_avx512vl();
        auVar104 = vpor_avx2(auVar104,_DAT_01fb4ba0);
        uVar25 = vpcmpgtd_avx512vl(auVar218._0_32_,auVar104);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar82 * 4 + lVar84);
        auVar102 = *(undefined1 (*) [32])(lVar84 + 0x22047f0 + lVar82 * 4);
        auVar116 = *(undefined1 (*) [32])(lVar84 + 0x2204c74 + lVar82 * 4);
        auVar115 = *(undefined1 (*) [32])(lVar84 + 0x22050f8 + lVar82 * 4);
        auVar208._0_4_ = auVar115._0_4_ * (float)local_360._0_4_;
        auVar208._4_4_ = auVar115._4_4_ * (float)local_360._4_4_;
        auVar208._8_4_ = auVar115._8_4_ * fStack_358;
        auVar208._12_4_ = auVar115._12_4_ * fStack_354;
        auVar208._16_4_ = auVar115._16_4_ * fStack_350;
        auVar208._20_4_ = auVar115._20_4_ * fStack_34c;
        auVar208._28_36_ = auVar199._28_36_;
        auVar208._24_4_ = auVar115._24_4_ * fStack_348;
        auVar199._0_4_ = auVar115._0_4_ * (float)local_380._0_4_;
        auVar199._4_4_ = auVar115._4_4_ * (float)local_380._4_4_;
        auVar199._8_4_ = auVar115._8_4_ * fStack_378;
        auVar199._12_4_ = auVar115._12_4_ * fStack_374;
        auVar199._16_4_ = auVar115._16_4_ * fStack_370;
        auVar199._20_4_ = auVar115._20_4_ * fStack_36c;
        auVar199._28_36_ = auVar193._28_36_;
        auVar199._24_4_ = auVar115._24_4_ * fStack_368;
        auVar114 = vmulps_avx512vl(local_100,auVar115);
        local_480 = auVar217._0_32_;
        auVar103 = vfmadd231ps_avx512vl(auVar208._0_32_,auVar116,local_320);
        auVar105 = vfmadd231ps_avx512vl(auVar199._0_32_,auVar116,local_340);
        auVar114 = vfmadd231ps_avx512vl(auVar114,auVar116,local_e0);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar102,local_2e0);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,local_300);
        auVar113 = vfmadd231ps_avx512vl(auVar114,auVar102,local_c0);
        auVar96 = vfmadd231ps_fma(auVar103,auVar104,local_2a0);
        auVar199 = ZEXT1664(auVar96);
        auVar97 = vfmadd231ps_fma(auVar105,auVar104,local_2c0);
        auVar193 = ZEXT1664(auVar97);
        auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar82 * 4 + lVar84);
        auVar103 = *(undefined1 (*) [32])(lVar84 + 0x2206c10 + lVar82 * 4);
        auVar108 = vfmadd231ps_avx512vl(auVar113,auVar104,local_a0);
        auVar105 = *(undefined1 (*) [32])(lVar84 + 0x2207094 + lVar82 * 4);
        auVar113 = *(undefined1 (*) [32])(lVar84 + 0x2207518 + lVar82 * 4);
        auVar217._0_4_ = auVar113._0_4_ * (float)local_360._0_4_;
        auVar217._4_4_ = auVar113._4_4_ * (float)local_360._4_4_;
        auVar217._8_4_ = auVar113._8_4_ * fStack_358;
        auVar217._12_4_ = auVar113._12_4_ * fStack_354;
        auVar217._16_4_ = auVar113._16_4_ * fStack_350;
        auVar217._20_4_ = auVar113._20_4_ * fStack_34c;
        auVar217._28_36_ = auVar201._28_36_;
        auVar217._24_4_ = auVar113._24_4_ * fStack_348;
        auVar55._4_4_ = auVar113._4_4_ * (float)local_380._4_4_;
        auVar55._0_4_ = auVar113._0_4_ * (float)local_380._0_4_;
        auVar55._8_4_ = auVar113._8_4_ * fStack_378;
        auVar55._12_4_ = auVar113._12_4_ * fStack_374;
        auVar55._16_4_ = auVar113._16_4_ * fStack_370;
        auVar55._20_4_ = auVar113._20_4_ * fStack_36c;
        auVar55._24_4_ = auVar113._24_4_ * fStack_368;
        auVar55._28_4_ = uStack_364;
        auVar106 = vmulps_avx512vl(local_100,auVar113);
        auVar107 = vfmadd231ps_avx512vl(auVar217._0_32_,auVar105,local_320);
        auVar217 = ZEXT3264(local_480);
        auVar101 = vfmadd231ps_avx512vl(auVar55,auVar105,local_340);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar105,local_e0);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,local_2e0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,local_300);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,local_c0);
        auVar152 = vfmadd231ps_fma(auVar107,auVar114,local_2a0);
        auVar201 = ZEXT1664(auVar152);
        auVar8 = vfmadd231ps_fma(auVar101,auVar114,local_2c0);
        auVar101 = vfmadd231ps_avx512vl(auVar106,auVar114,local_a0);
        auVar99 = vmaxps_avx512vl(auVar108,auVar101);
        auVar106 = vsubps_avx(ZEXT1632(auVar152),ZEXT1632(auVar96));
        auVar107 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar97));
        auVar100 = vmulps_avx512vl(ZEXT1632(auVar97),auVar106);
        auVar109 = vmulps_avx512vl(ZEXT1632(auVar96),auVar107);
        auVar100 = vsubps_avx512vl(auVar100,auVar109);
        auVar109 = vmulps_avx512vl(auVar107,auVar107);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar106);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        auVar99 = vmulps_avx512vl(auVar99,auVar109);
        auVar100 = vmulps_avx512vl(auVar100,auVar100);
        uVar24 = vcmpps_avx512vl(auVar100,auVar99,2);
        bVar88 = (byte)uVar25 & (byte)uVar24;
        if (bVar88 != 0) {
          auVar113 = vmulps_avx512vl(local_160,auVar113);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_540,auVar113);
          local_4a0 = auVar219._0_32_;
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_4a0,auVar105);
          auVar114 = vfmadd213ps_avx512vl(auVar114,local_480,auVar103);
          auVar115 = vmulps_avx512vl(local_160,auVar115);
          auVar116 = vfmadd213ps_avx512vl(auVar116,local_540,auVar115);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_4a0,auVar116);
          auVar103 = vfmadd213ps_avx512vl(auVar104,local_480,auVar102);
          auVar104 = *(undefined1 (*) [32])(lVar84 + 0x220557c + lVar82 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar84 + 0x2205a00 + lVar82 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar84 + 0x2205e84 + lVar82 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar84 + 0x2206308 + lVar82 * 4);
          auVar105 = vmulps_avx512vl(_local_360,auVar115);
          auVar113 = vmulps_avx512vl(_local_380,auVar115);
          auVar115 = vmulps_avx512vl(local_160,auVar115);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar116,local_320);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar116,local_340);
          auVar95 = vfmadd231ps_fma(auVar115,auVar116,local_540);
          auVar116 = vfmadd231ps_avx512vl(auVar105,auVar102,local_2e0);
          auVar115 = vfmadd231ps_avx512vl(auVar113,auVar102,local_300);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),local_4a0,auVar102);
          auVar105 = vfmadd231ps_avx512vl(auVar116,auVar104,local_2a0);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar104,local_2c0);
          auVar113 = vfmadd231ps_avx512vl(auVar102,local_480,auVar104);
          auVar104 = *(undefined1 (*) [32])(lVar84 + 0x220799c + lVar82 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar84 + 0x22082a4 + lVar82 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar84 + 0x2208728 + lVar82 * 4);
          auVar99 = vmulps_avx512vl(_local_360,auVar116);
          auVar100 = vmulps_avx512vl(_local_380,auVar116);
          auVar116 = vmulps_avx512vl(local_160,auVar116);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_320);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,local_340);
          auVar116 = vfmadd231ps_avx512vl(auVar116,local_540,auVar102);
          auVar102 = *(undefined1 (*) [32])(lVar84 + 0x2207e20 + lVar82 * 4);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_2e0);
          auVar217 = ZEXT3264(local_480);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,local_300);
          auVar102 = vfmadd231ps_avx512vl(auVar116,local_4a0,auVar102);
          auVar116 = vfmadd231ps_avx512vl(auVar99,auVar104,local_2a0);
          auVar99 = vfmadd231ps_avx512vl(auVar100,auVar104,local_2c0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,local_480,auVar104);
          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar105,auVar100);
          vandps_avx512vl(auVar115,auVar100);
          auVar104 = vmaxps_avx(auVar100,auVar100);
          vandps_avx512vl(auVar113,auVar100);
          auVar104 = vmaxps_avx(auVar104,auVar100);
          auVar77._4_4_ = fStack_45c;
          auVar77._0_4_ = local_460;
          auVar77._8_4_ = fStack_458;
          auVar77._12_4_ = fStack_454;
          auVar77._16_4_ = fStack_450;
          auVar77._20_4_ = fStack_44c;
          auVar77._24_4_ = fStack_448;
          auVar77._28_4_ = fStack_444;
          uVar80 = vcmpps_avx512vl(auVar104,auVar77,1);
          bVar17 = (bool)((byte)uVar80 & 1);
          auVar129._0_4_ = (float)((uint)bVar17 * auVar106._0_4_ | (uint)!bVar17 * auVar105._0_4_);
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar105._4_4_);
          bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar105._8_4_);
          bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar129._12_4_ =
               (float)((uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar105._12_4_);
          bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar129._16_4_ =
               (float)((uint)bVar17 * auVar106._16_4_ | (uint)!bVar17 * auVar105._16_4_);
          bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar129._20_4_ =
               (float)((uint)bVar17 * auVar106._20_4_ | (uint)!bVar17 * auVar105._20_4_);
          bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar129._24_4_ =
               (float)((uint)bVar17 * auVar106._24_4_ | (uint)!bVar17 * auVar105._24_4_);
          bVar17 = SUB81(uVar80 >> 7,0);
          auVar129._28_4_ = (uint)bVar17 * auVar106._28_4_ | (uint)!bVar17 * auVar105._28_4_;
          bVar17 = (bool)((byte)uVar80 & 1);
          auVar130._0_4_ = (float)((uint)bVar17 * auVar107._0_4_ | (uint)!bVar17 * auVar115._0_4_);
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar130._4_4_ = (float)((uint)bVar17 * auVar107._4_4_ | (uint)!bVar17 * auVar115._4_4_);
          bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar130._8_4_ = (float)((uint)bVar17 * auVar107._8_4_ | (uint)!bVar17 * auVar115._8_4_);
          bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar130._12_4_ =
               (float)((uint)bVar17 * auVar107._12_4_ | (uint)!bVar17 * auVar115._12_4_);
          bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar130._16_4_ =
               (float)((uint)bVar17 * auVar107._16_4_ | (uint)!bVar17 * auVar115._16_4_);
          bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar130._20_4_ =
               (float)((uint)bVar17 * auVar107._20_4_ | (uint)!bVar17 * auVar115._20_4_);
          bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar130._24_4_ =
               (float)((uint)bVar17 * auVar107._24_4_ | (uint)!bVar17 * auVar115._24_4_);
          bVar17 = SUB81(uVar80 >> 7,0);
          auVar130._28_4_ = (uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar115._28_4_;
          vandps_avx512vl(auVar116,auVar100);
          vandps_avx512vl(auVar99,auVar100);
          auVar104 = vmaxps_avx(auVar130,auVar130);
          vandps_avx512vl(auVar102,auVar100);
          auVar104 = vmaxps_avx(auVar104,auVar130);
          uVar80 = vcmpps_avx512vl(auVar104,auVar77,1);
          bVar17 = (bool)((byte)uVar80 & 1);
          auVar131._0_4_ = (uint)bVar17 * auVar106._0_4_ | (uint)!bVar17 * auVar116._0_4_;
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar17 * auVar106._4_4_ | (uint)!bVar17 * auVar116._4_4_;
          bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar17 * auVar106._8_4_ | (uint)!bVar17 * auVar116._8_4_;
          bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar17 * auVar106._12_4_ | (uint)!bVar17 * auVar116._12_4_;
          bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar131._16_4_ = (uint)bVar17 * auVar106._16_4_ | (uint)!bVar17 * auVar116._16_4_;
          bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar131._20_4_ = (uint)bVar17 * auVar106._20_4_ | (uint)!bVar17 * auVar116._20_4_;
          bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar131._24_4_ = (uint)bVar17 * auVar106._24_4_ | (uint)!bVar17 * auVar116._24_4_;
          bVar17 = SUB81(uVar80 >> 7,0);
          auVar131._28_4_ = (uint)bVar17 * auVar106._28_4_ | (uint)!bVar17 * auVar116._28_4_;
          bVar17 = (bool)((byte)uVar80 & 1);
          auVar132._0_4_ = (float)((uint)bVar17 * auVar107._0_4_ | (uint)!bVar17 * auVar99._0_4_);
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar132._4_4_ = (float)((uint)bVar17 * auVar107._4_4_ | (uint)!bVar17 * auVar99._4_4_);
          bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar132._8_4_ = (float)((uint)bVar17 * auVar107._8_4_ | (uint)!bVar17 * auVar99._8_4_);
          bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar132._12_4_ = (float)((uint)bVar17 * auVar107._12_4_ | (uint)!bVar17 * auVar99._12_4_)
          ;
          bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar132._16_4_ = (float)((uint)bVar17 * auVar107._16_4_ | (uint)!bVar17 * auVar99._16_4_)
          ;
          bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar132._20_4_ = (float)((uint)bVar17 * auVar107._20_4_ | (uint)!bVar17 * auVar99._20_4_)
          ;
          bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar132._24_4_ = (float)((uint)bVar17 * auVar107._24_4_ | (uint)!bVar17 * auVar99._24_4_)
          ;
          bVar17 = SUB81(uVar80 >> 7,0);
          auVar132._28_4_ = (uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar99._28_4_;
          auVar205._8_4_ = 0x80000000;
          auVar205._0_8_ = 0x8000000080000000;
          auVar205._12_4_ = 0x80000000;
          auVar205._16_4_ = 0x80000000;
          auVar205._20_4_ = 0x80000000;
          auVar205._24_4_ = 0x80000000;
          auVar205._28_4_ = 0x80000000;
          auVar104 = vxorps_avx512vl(auVar131,auVar205);
          auVar98 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
          auVar102 = vfmadd213ps_avx512vl(auVar129,auVar129,ZEXT1632(auVar98));
          auVar95 = vfmadd231ps_fma(auVar102,auVar130,auVar130);
          auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
          auVar216._8_4_ = 0xbf000000;
          auVar216._0_8_ = 0xbf000000bf000000;
          auVar216._12_4_ = 0xbf000000;
          auVar216._16_4_ = 0xbf000000;
          auVar216._20_4_ = 0xbf000000;
          auVar216._24_4_ = 0xbf000000;
          auVar216._28_4_ = 0xbf000000;
          fVar166 = auVar102._0_4_;
          fVar150 = auVar102._4_4_;
          fVar163 = auVar102._8_4_;
          fVar164 = auVar102._12_4_;
          fVar173 = auVar102._16_4_;
          fVar172 = auVar102._20_4_;
          fVar187 = auVar102._24_4_;
          auVar56._4_4_ = fVar150 * fVar150 * fVar150 * auVar95._4_4_ * -0.5;
          auVar56._0_4_ = fVar166 * fVar166 * fVar166 * auVar95._0_4_ * -0.5;
          auVar56._8_4_ = fVar163 * fVar163 * fVar163 * auVar95._8_4_ * -0.5;
          auVar56._12_4_ = fVar164 * fVar164 * fVar164 * auVar95._12_4_ * -0.5;
          auVar56._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar56._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar56._24_4_ = fVar187 * fVar187 * fVar187 * -0.0;
          auVar56._28_4_ = auVar130._28_4_;
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar102 = vfmadd231ps_avx512vl(auVar56,auVar116,auVar102);
          auVar57._4_4_ = auVar130._4_4_ * auVar102._4_4_;
          auVar57._0_4_ = auVar130._0_4_ * auVar102._0_4_;
          auVar57._8_4_ = auVar130._8_4_ * auVar102._8_4_;
          auVar57._12_4_ = auVar130._12_4_ * auVar102._12_4_;
          auVar57._16_4_ = auVar130._16_4_ * auVar102._16_4_;
          auVar57._20_4_ = auVar130._20_4_ * auVar102._20_4_;
          auVar57._24_4_ = auVar130._24_4_ * auVar102._24_4_;
          auVar57._28_4_ = 0;
          auVar58._4_4_ = auVar102._4_4_ * -auVar129._4_4_;
          auVar58._0_4_ = auVar102._0_4_ * -auVar129._0_4_;
          auVar58._8_4_ = auVar102._8_4_ * -auVar129._8_4_;
          auVar58._12_4_ = auVar102._12_4_ * -auVar129._12_4_;
          auVar58._16_4_ = auVar102._16_4_ * -auVar129._16_4_;
          auVar58._20_4_ = auVar102._20_4_ * -auVar129._20_4_;
          auVar58._24_4_ = auVar102._24_4_ * -auVar129._24_4_;
          auVar58._28_4_ = auVar130._28_4_;
          auVar115 = vmulps_avx512vl(auVar102,ZEXT1632(auVar98));
          auVar113 = ZEXT1632(auVar98);
          auVar102 = vfmadd213ps_avx512vl(auVar131,auVar131,auVar113);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar132,auVar132);
          auVar105 = vrsqrt14ps_avx512vl(auVar102);
          auVar102 = vmulps_avx512vl(auVar102,auVar216);
          fVar166 = auVar105._0_4_;
          fVar150 = auVar105._4_4_;
          fVar163 = auVar105._8_4_;
          fVar164 = auVar105._12_4_;
          fVar173 = auVar105._16_4_;
          fVar172 = auVar105._20_4_;
          fVar187 = auVar105._24_4_;
          auVar59._4_4_ = fVar150 * fVar150 * fVar150 * auVar102._4_4_;
          auVar59._0_4_ = fVar166 * fVar166 * fVar166 * auVar102._0_4_;
          auVar59._8_4_ = fVar163 * fVar163 * fVar163 * auVar102._8_4_;
          auVar59._12_4_ = fVar164 * fVar164 * fVar164 * auVar102._12_4_;
          auVar59._16_4_ = fVar173 * fVar173 * fVar173 * auVar102._16_4_;
          auVar59._20_4_ = fVar172 * fVar172 * fVar172 * auVar102._20_4_;
          auVar59._24_4_ = fVar187 * fVar187 * fVar187 * auVar102._24_4_;
          auVar59._28_4_ = auVar102._28_4_;
          auVar102 = vfmadd231ps_avx512vl(auVar59,auVar116,auVar105);
          auVar60._4_4_ = auVar132._4_4_ * auVar102._4_4_;
          auVar60._0_4_ = auVar132._0_4_ * auVar102._0_4_;
          auVar60._8_4_ = auVar132._8_4_ * auVar102._8_4_;
          auVar60._12_4_ = auVar132._12_4_ * auVar102._12_4_;
          auVar60._16_4_ = auVar132._16_4_ * auVar102._16_4_;
          auVar60._20_4_ = auVar132._20_4_ * auVar102._20_4_;
          auVar60._24_4_ = auVar132._24_4_ * auVar102._24_4_;
          auVar60._28_4_ = auVar105._28_4_;
          auVar61._4_4_ = auVar102._4_4_ * auVar104._4_4_;
          auVar61._0_4_ = auVar102._0_4_ * auVar104._0_4_;
          auVar61._8_4_ = auVar102._8_4_ * auVar104._8_4_;
          auVar61._12_4_ = auVar102._12_4_ * auVar104._12_4_;
          auVar61._16_4_ = auVar102._16_4_ * auVar104._16_4_;
          auVar61._20_4_ = auVar102._20_4_ * auVar104._20_4_;
          auVar61._24_4_ = auVar102._24_4_ * auVar104._24_4_;
          auVar61._28_4_ = auVar104._28_4_;
          auVar104 = vmulps_avx512vl(auVar102,auVar113);
          auVar95 = vfmadd213ps_fma(auVar57,auVar108,ZEXT1632(auVar96));
          auVar154 = vfmadd213ps_fma(auVar58,auVar108,ZEXT1632(auVar97));
          auVar116 = vfmadd213ps_avx512vl(auVar115,auVar108,auVar103);
          auVar105 = vfmadd213ps_avx512vl(auVar60,auVar101,ZEXT1632(auVar152));
          auVar91 = vfnmadd213ps_fma(auVar57,auVar108,ZEXT1632(auVar96));
          auVar96 = vfmadd213ps_fma(auVar61,auVar101,ZEXT1632(auVar8));
          auVar202 = vfnmadd213ps_fma(auVar58,auVar108,ZEXT1632(auVar97));
          auVar97 = vfmadd213ps_fma(auVar104,auVar101,auVar114);
          auVar28 = vfnmadd231ps_fma(auVar103,auVar108,auVar115);
          auVar174 = vfnmadd213ps_fma(auVar60,auVar101,ZEXT1632(auVar152));
          auVar92 = vfnmadd213ps_fma(auVar61,auVar101,ZEXT1632(auVar8));
          auVar93 = vfnmadd231ps_fma(auVar114,auVar101,auVar104);
          auVar114 = vsubps_avx512vl(auVar105,ZEXT1632(auVar91));
          auVar104 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar202));
          auVar102 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar28));
          auVar62._4_4_ = auVar104._4_4_ * auVar28._4_4_;
          auVar62._0_4_ = auVar104._0_4_ * auVar28._0_4_;
          auVar62._8_4_ = auVar104._8_4_ * auVar28._8_4_;
          auVar62._12_4_ = auVar104._12_4_ * auVar28._12_4_;
          auVar62._16_4_ = auVar104._16_4_ * 0.0;
          auVar62._20_4_ = auVar104._20_4_ * 0.0;
          auVar62._24_4_ = auVar104._24_4_ * 0.0;
          auVar62._28_4_ = auVar115._28_4_;
          auVar152 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar202),auVar102);
          auVar63._4_4_ = auVar102._4_4_ * auVar91._4_4_;
          auVar63._0_4_ = auVar102._0_4_ * auVar91._0_4_;
          auVar63._8_4_ = auVar102._8_4_ * auVar91._8_4_;
          auVar63._12_4_ = auVar102._12_4_ * auVar91._12_4_;
          auVar63._16_4_ = auVar102._16_4_ * 0.0;
          auVar63._20_4_ = auVar102._20_4_ * 0.0;
          auVar63._24_4_ = auVar102._24_4_ * 0.0;
          auVar63._28_4_ = auVar102._28_4_;
          auVar8 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar28),auVar114);
          auVar64._4_4_ = auVar202._4_4_ * auVar114._4_4_;
          auVar64._0_4_ = auVar202._0_4_ * auVar114._0_4_;
          auVar64._8_4_ = auVar202._8_4_ * auVar114._8_4_;
          auVar64._12_4_ = auVar202._12_4_ * auVar114._12_4_;
          auVar64._16_4_ = auVar114._16_4_ * 0.0;
          auVar64._20_4_ = auVar114._20_4_ * 0.0;
          auVar64._24_4_ = auVar114._24_4_ * 0.0;
          auVar64._28_4_ = auVar114._28_4_;
          auVar94 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar91),auVar104);
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar113,ZEXT1632(auVar8));
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,ZEXT1632(auVar152));
          auVar100 = ZEXT1632(auVar98);
          uVar80 = vcmpps_avx512vl(auVar104,auVar100,2);
          bVar79 = (byte)uVar80;
          fVar142 = (float)((uint)(bVar79 & 1) * auVar95._0_4_ |
                           (uint)!(bool)(bVar79 & 1) * auVar174._0_4_);
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          fVar144 = (float)((uint)bVar17 * auVar95._4_4_ | (uint)!bVar17 * auVar174._4_4_);
          bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
          fVar146 = (float)((uint)bVar17 * auVar95._8_4_ | (uint)!bVar17 * auVar174._8_4_);
          bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
          fVar148 = (float)((uint)bVar17 * auVar95._12_4_ | (uint)!bVar17 * auVar174._12_4_);
          auVar113 = ZEXT1632(CONCAT412(fVar148,CONCAT48(fVar146,CONCAT44(fVar144,fVar142))));
          fVar143 = (float)((uint)(bVar79 & 1) * auVar154._0_4_ |
                           (uint)!(bool)(bVar79 & 1) * auVar92._0_4_);
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          fVar145 = (float)((uint)bVar17 * auVar154._4_4_ | (uint)!bVar17 * auVar92._4_4_);
          bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
          fVar147 = (float)((uint)bVar17 * auVar154._8_4_ | (uint)!bVar17 * auVar92._8_4_);
          bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
          fVar149 = (float)((uint)bVar17 * auVar154._12_4_ | (uint)!bVar17 * auVar92._12_4_);
          auVar106 = ZEXT1632(CONCAT412(fVar149,CONCAT48(fVar147,CONCAT44(fVar145,fVar143))));
          auVar133._0_4_ =
               (float)((uint)(bVar79 & 1) * auVar116._0_4_ |
                      (uint)!(bool)(bVar79 & 1) * auVar93._0_4_);
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar133._4_4_ = (float)((uint)bVar17 * auVar116._4_4_ | (uint)!bVar17 * auVar93._4_4_);
          bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar133._8_4_ = (float)((uint)bVar17 * auVar116._8_4_ | (uint)!bVar17 * auVar93._8_4_);
          bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar133._12_4_ = (float)((uint)bVar17 * auVar116._12_4_ | (uint)!bVar17 * auVar93._12_4_)
          ;
          fVar166 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar116._16_4_);
          auVar133._16_4_ = fVar166;
          fVar150 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar116._20_4_);
          auVar133._20_4_ = fVar150;
          fVar163 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar116._24_4_);
          auVar133._24_4_ = fVar163;
          iVar1 = (uint)(byte)(uVar80 >> 7) * auVar116._28_4_;
          auVar133._28_4_ = iVar1;
          auVar104 = vblendmps_avx512vl(ZEXT1632(auVar91),auVar105);
          auVar134._0_4_ =
               (uint)(bVar79 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar152._0_4_;
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar17 * auVar104._4_4_ | (uint)!bVar17 * auVar152._4_4_;
          bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar17 * auVar104._8_4_ | (uint)!bVar17 * auVar152._8_4_;
          bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * auVar152._12_4_;
          auVar134._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar104._16_4_;
          auVar134._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar104._20_4_;
          auVar134._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar104._24_4_;
          auVar134._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar104._28_4_;
          auVar104 = vblendmps_avx512vl(ZEXT1632(auVar202),ZEXT1632(auVar96));
          auVar135._0_4_ =
               (float)((uint)(bVar79 & 1) * auVar104._0_4_ |
                      (uint)!(bool)(bVar79 & 1) * auVar95._0_4_);
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar135._4_4_ = (float)((uint)bVar17 * auVar104._4_4_ | (uint)!bVar17 * auVar95._4_4_);
          bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar135._8_4_ = (float)((uint)bVar17 * auVar104._8_4_ | (uint)!bVar17 * auVar95._8_4_);
          bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar135._12_4_ = (float)((uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * auVar95._12_4_)
          ;
          fVar164 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar104._16_4_);
          auVar135._16_4_ = fVar164;
          fVar173 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar104._20_4_);
          auVar135._20_4_ = fVar173;
          fVar172 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar104._24_4_);
          auVar135._24_4_ = fVar172;
          auVar135._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar104._28_4_;
          auVar104 = vblendmps_avx512vl(ZEXT1632(auVar28),ZEXT1632(auVar97));
          auVar136._0_4_ =
               (float)((uint)(bVar79 & 1) * auVar104._0_4_ |
                      (uint)!(bool)(bVar79 & 1) * auVar154._0_4_);
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar136._4_4_ = (float)((uint)bVar17 * auVar104._4_4_ | (uint)!bVar17 * auVar154._4_4_);
          bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar136._8_4_ = (float)((uint)bVar17 * auVar104._8_4_ | (uint)!bVar17 * auVar154._8_4_);
          bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar136._12_4_ =
               (float)((uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * auVar154._12_4_);
          fVar187 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar104._16_4_);
          auVar136._16_4_ = fVar187;
          fVar171 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar104._20_4_);
          auVar136._20_4_ = fVar171;
          fVar90 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar104._24_4_);
          auVar136._24_4_ = fVar90;
          iVar2 = (uint)(byte)(uVar80 >> 7) * auVar104._28_4_;
          auVar136._28_4_ = iVar2;
          auVar137._0_4_ =
               (uint)(bVar79 & 1) * (int)auVar91._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar105._0_4_;
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar17 * (int)auVar91._4_4_ | (uint)!bVar17 * auVar105._4_4_;
          bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar17 * (int)auVar91._8_4_ | (uint)!bVar17 * auVar105._8_4_;
          bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar17 * (int)auVar91._12_4_ | (uint)!bVar17 * auVar105._12_4_;
          auVar137._16_4_ = (uint)!(bool)((byte)(uVar80 >> 4) & 1) * auVar105._16_4_;
          auVar137._20_4_ = (uint)!(bool)((byte)(uVar80 >> 5) & 1) * auVar105._20_4_;
          auVar137._24_4_ = (uint)!(bool)((byte)(uVar80 >> 6) & 1) * auVar105._24_4_;
          auVar137._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar105._28_4_;
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar80 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar80 >> 3) & 1);
          bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar80 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar105 = vsubps_avx512vl(auVar137,auVar113);
          auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar202._12_4_ |
                                                   (uint)!bVar21 * auVar96._12_4_,
                                                   CONCAT48((uint)bVar19 * (int)auVar202._8_4_ |
                                                            (uint)!bVar19 * auVar96._8_4_,
                                                            CONCAT44((uint)bVar17 *
                                                                     (int)auVar202._4_4_ |
                                                                     (uint)!bVar17 * auVar96._4_4_,
                                                                     (uint)(bVar79 & 1) *
                                                                     (int)auVar202._0_4_ |
                                                                     (uint)!(bool)(bVar79 & 1) *
                                                                     auVar96._0_4_)))),auVar106);
          auVar199 = ZEXT3264(auVar102);
          auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar28._12_4_ |
                                                   (uint)!bVar22 * auVar97._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar28._8_4_ |
                                                            (uint)!bVar20 * auVar97._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar28._4_4_ |
                                                                     (uint)!bVar18 * auVar97._4_4_,
                                                                     (uint)(bVar79 & 1) *
                                                                     (int)auVar28._0_4_ |
                                                                     (uint)!(bool)(bVar79 & 1) *
                                                                     auVar97._0_4_)))),auVar133);
          auVar115 = vsubps_avx(auVar113,auVar134);
          auVar201 = ZEXT3264(auVar115);
          auVar114 = vsubps_avx(auVar106,auVar135);
          auVar103 = vsubps_avx(auVar133,auVar136);
          auVar65._4_4_ = auVar116._4_4_ * fVar144;
          auVar65._0_4_ = auVar116._0_4_ * fVar142;
          auVar65._8_4_ = auVar116._8_4_ * fVar146;
          auVar65._12_4_ = auVar116._12_4_ * fVar148;
          auVar65._16_4_ = auVar116._16_4_ * 0.0;
          auVar65._20_4_ = auVar116._20_4_ * 0.0;
          auVar65._24_4_ = auVar116._24_4_ * 0.0;
          auVar65._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar65,auVar133,auVar105);
          auVar185._0_4_ = fVar143 * auVar105._0_4_;
          auVar185._4_4_ = fVar145 * auVar105._4_4_;
          auVar185._8_4_ = fVar147 * auVar105._8_4_;
          auVar185._12_4_ = fVar149 * auVar105._12_4_;
          auVar185._16_4_ = auVar105._16_4_ * 0.0;
          auVar185._20_4_ = auVar105._20_4_ * 0.0;
          auVar185._24_4_ = auVar105._24_4_ * 0.0;
          auVar185._28_4_ = 0;
          auVar97 = vfmsub231ps_fma(auVar185,auVar113,auVar102);
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar100,ZEXT1632(auVar96));
          auVar191._0_4_ = auVar102._0_4_ * auVar133._0_4_;
          auVar191._4_4_ = auVar102._4_4_ * auVar133._4_4_;
          auVar191._8_4_ = auVar102._8_4_ * auVar133._8_4_;
          auVar191._12_4_ = auVar102._12_4_ * auVar133._12_4_;
          auVar191._16_4_ = auVar102._16_4_ * fVar166;
          auVar191._20_4_ = auVar102._20_4_ * fVar150;
          auVar191._24_4_ = auVar102._24_4_ * fVar163;
          auVar191._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar191,auVar106,auVar116);
          auVar107 = vfmadd231ps_avx512vl(auVar104,auVar100,ZEXT1632(auVar96));
          auVar104 = vmulps_avx512vl(auVar103,auVar134);
          auVar104 = vfmsub231ps_avx512vl(auVar104,auVar115,auVar136);
          auVar66._4_4_ = auVar114._4_4_ * auVar136._4_4_;
          auVar66._0_4_ = auVar114._0_4_ * auVar136._0_4_;
          auVar66._8_4_ = auVar114._8_4_ * auVar136._8_4_;
          auVar66._12_4_ = auVar114._12_4_ * auVar136._12_4_;
          auVar66._16_4_ = auVar114._16_4_ * fVar187;
          auVar66._20_4_ = auVar114._20_4_ * fVar171;
          auVar66._24_4_ = auVar114._24_4_ * fVar90;
          auVar66._28_4_ = iVar2;
          auVar96 = vfmsub231ps_fma(auVar66,auVar135,auVar103);
          auVar192._0_4_ = auVar135._0_4_ * auVar115._0_4_;
          auVar192._4_4_ = auVar135._4_4_ * auVar115._4_4_;
          auVar192._8_4_ = auVar135._8_4_ * auVar115._8_4_;
          auVar192._12_4_ = auVar135._12_4_ * auVar115._12_4_;
          auVar192._16_4_ = fVar164 * auVar115._16_4_;
          auVar192._20_4_ = fVar173 * auVar115._20_4_;
          auVar192._24_4_ = fVar172 * auVar115._24_4_;
          auVar192._28_4_ = 0;
          auVar97 = vfmsub231ps_fma(auVar192,auVar114,auVar134);
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar100,auVar104);
          auVar99 = vfmadd231ps_avx512vl(auVar104,auVar100,ZEXT1632(auVar96));
          auVar193 = ZEXT3264(auVar99);
          auVar104 = vmaxps_avx(auVar107,auVar99);
          uVar24 = vcmpps_avx512vl(auVar104,auVar100,2);
          bVar88 = bVar88 & (byte)uVar24;
          if (bVar88 != 0) {
            auVar67._4_4_ = auVar103._4_4_ * auVar102._4_4_;
            auVar67._0_4_ = auVar103._0_4_ * auVar102._0_4_;
            auVar67._8_4_ = auVar103._8_4_ * auVar102._8_4_;
            auVar67._12_4_ = auVar103._12_4_ * auVar102._12_4_;
            auVar67._16_4_ = auVar103._16_4_ * auVar102._16_4_;
            auVar67._20_4_ = auVar103._20_4_ * auVar102._20_4_;
            auVar67._24_4_ = auVar103._24_4_ * auVar102._24_4_;
            auVar67._28_4_ = auVar104._28_4_;
            auVar8 = vfmsub231ps_fma(auVar67,auVar114,auVar116);
            auVar68._4_4_ = auVar116._4_4_ * auVar115._4_4_;
            auVar68._0_4_ = auVar116._0_4_ * auVar115._0_4_;
            auVar68._8_4_ = auVar116._8_4_ * auVar115._8_4_;
            auVar68._12_4_ = auVar116._12_4_ * auVar115._12_4_;
            auVar68._16_4_ = auVar116._16_4_ * auVar115._16_4_;
            auVar68._20_4_ = auVar116._20_4_ * auVar115._20_4_;
            auVar68._24_4_ = auVar116._24_4_ * auVar115._24_4_;
            auVar68._28_4_ = auVar116._28_4_;
            auVar152 = vfmsub231ps_fma(auVar68,auVar105,auVar103);
            auVar69._4_4_ = auVar114._4_4_ * auVar105._4_4_;
            auVar69._0_4_ = auVar114._0_4_ * auVar105._0_4_;
            auVar69._8_4_ = auVar114._8_4_ * auVar105._8_4_;
            auVar69._12_4_ = auVar114._12_4_ * auVar105._12_4_;
            auVar69._16_4_ = auVar114._16_4_ * auVar105._16_4_;
            auVar69._20_4_ = auVar114._20_4_ * auVar105._20_4_;
            auVar69._24_4_ = auVar114._24_4_ * auVar105._24_4_;
            auVar69._28_4_ = auVar114._28_4_;
            auVar95 = vfmsub231ps_fma(auVar69,auVar115,auVar102);
            auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar152),ZEXT1632(auVar95));
            auVar97 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar8),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar104 = vrcp14ps_avx512vl(ZEXT1632(auVar97));
            auVar201 = ZEXT3264(auVar104);
            auVar34._8_4_ = 0x3f800000;
            auVar34._0_8_ = 0x3f8000003f800000;
            auVar34._12_4_ = 0x3f800000;
            auVar34._16_4_ = 0x3f800000;
            auVar34._20_4_ = 0x3f800000;
            auVar34._24_4_ = 0x3f800000;
            auVar34._28_4_ = 0x3f800000;
            auVar102 = vfnmadd213ps_avx512vl(auVar104,ZEXT1632(auVar97),auVar34);
            auVar96 = vfmadd132ps_fma(auVar102,auVar104,auVar104);
            auVar199 = ZEXT1664(auVar96);
            auVar70._4_4_ = auVar95._4_4_ * auVar133._4_4_;
            auVar70._0_4_ = auVar95._0_4_ * auVar133._0_4_;
            auVar70._8_4_ = auVar95._8_4_ * auVar133._8_4_;
            auVar70._12_4_ = auVar95._12_4_ * auVar133._12_4_;
            auVar70._16_4_ = fVar166 * 0.0;
            auVar70._20_4_ = fVar150 * 0.0;
            auVar70._24_4_ = fVar163 * 0.0;
            auVar70._28_4_ = iVar1;
            auVar152 = vfmadd231ps_fma(auVar70,auVar106,ZEXT1632(auVar152));
            auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar113,ZEXT1632(auVar8));
            fVar166 = auVar96._0_4_;
            fVar150 = auVar96._4_4_;
            fVar163 = auVar96._8_4_;
            fVar164 = auVar96._12_4_;
            local_240 = ZEXT1632(CONCAT412(auVar152._12_4_ * fVar164,
                                           CONCAT48(auVar152._8_4_ * fVar163,
                                                    CONCAT44(auVar152._4_4_ * fVar150,
                                                             auVar152._0_4_ * fVar166))));
            auVar208 = ZEXT3264(local_240);
            auVar78._4_4_ = uStack_43c;
            auVar78._0_4_ = local_440;
            auVar78._8_4_ = uStack_438;
            auVar78._12_4_ = uStack_434;
            auVar78._16_4_ = uStack_430;
            auVar78._20_4_ = uStack_42c;
            auVar78._24_4_ = uStack_428;
            auVar78._28_4_ = uStack_424;
            uVar24 = vcmpps_avx512vl(local_240,auVar78,0xd);
            uVar151 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar35._4_4_ = uVar151;
            auVar35._0_4_ = uVar151;
            auVar35._8_4_ = uVar151;
            auVar35._12_4_ = uVar151;
            auVar35._16_4_ = uVar151;
            auVar35._20_4_ = uVar151;
            auVar35._24_4_ = uVar151;
            auVar35._28_4_ = uVar151;
            uVar25 = vcmpps_avx512vl(local_240,auVar35,2);
            bVar88 = (byte)uVar24 & (byte)uVar25 & bVar88;
            if (bVar88 != 0) {
              uVar86 = vcmpps_avx512vl(ZEXT1632(auVar97),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar86 = bVar88 & uVar86;
              if ((char)uVar86 != '\0') {
                fVar173 = auVar107._0_4_ * fVar166;
                fVar172 = auVar107._4_4_ * fVar150;
                auVar71._4_4_ = fVar172;
                auVar71._0_4_ = fVar173;
                fVar187 = auVar107._8_4_ * fVar163;
                auVar71._8_4_ = fVar187;
                fVar90 = auVar107._12_4_ * fVar164;
                auVar71._12_4_ = fVar90;
                fVar171 = auVar107._16_4_ * 0.0;
                auVar71._16_4_ = fVar171;
                fVar142 = auVar107._20_4_ * 0.0;
                auVar71._20_4_ = fVar142;
                fVar143 = auVar107._24_4_ * 0.0;
                auVar71._24_4_ = fVar143;
                auVar71._28_4_ = auVar107._28_4_;
                auVar170._8_4_ = 0x3f800000;
                auVar170._0_8_ = 0x3f8000003f800000;
                auVar170._12_4_ = 0x3f800000;
                auVar170._16_4_ = 0x3f800000;
                auVar170._20_4_ = 0x3f800000;
                auVar170._24_4_ = 0x3f800000;
                auVar170._28_4_ = 0x3f800000;
                auVar104 = vsubps_avx(auVar170,auVar71);
                local_280._0_4_ =
                     (float)((uint)(bVar79 & 1) * (int)fVar173 |
                            (uint)!(bool)(bVar79 & 1) * auVar104._0_4_);
                bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
                local_280._4_4_ =
                     (float)((uint)bVar17 * (int)fVar172 | (uint)!bVar17 * auVar104._4_4_);
                bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
                local_280._8_4_ =
                     (float)((uint)bVar17 * (int)fVar187 | (uint)!bVar17 * auVar104._8_4_);
                bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
                local_280._12_4_ =
                     (float)((uint)bVar17 * (int)fVar90 | (uint)!bVar17 * auVar104._12_4_);
                bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
                local_280._16_4_ =
                     (float)((uint)bVar17 * (int)fVar171 | (uint)!bVar17 * auVar104._16_4_);
                bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
                local_280._20_4_ =
                     (float)((uint)bVar17 * (int)fVar142 | (uint)!bVar17 * auVar104._20_4_);
                bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
                local_280._24_4_ =
                     (float)((uint)bVar17 * (int)fVar143 | (uint)!bVar17 * auVar104._24_4_);
                bVar17 = SUB81(uVar80 >> 7,0);
                local_280._28_4_ =
                     (float)((uint)bVar17 * auVar107._28_4_ | (uint)!bVar17 * auVar104._28_4_);
                auVar104 = vsubps_avx(auVar101,auVar108);
                auVar96 = vfmadd213ps_fma(auVar104,local_280,auVar108);
                uVar151 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
                auVar36._4_4_ = uVar151;
                auVar36._0_4_ = uVar151;
                auVar36._8_4_ = uVar151;
                auVar36._12_4_ = uVar151;
                auVar36._16_4_ = uVar151;
                auVar36._20_4_ = uVar151;
                auVar36._24_4_ = uVar151;
                auVar36._28_4_ = uVar151;
                auVar104 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                              CONCAT48(auVar96._8_4_ + auVar96._8_4_
                                                                       ,CONCAT44(auVar96._4_4_ +
                                                                                 auVar96._4_4_,
                                                                                 auVar96._0_4_ +
                                                                                 auVar96._0_4_)))),
                                           auVar36);
                uVar89 = vcmpps_avx512vl(local_240,auVar104,6);
                uVar86 = uVar86 & uVar89;
                bVar88 = (byte)uVar86;
                if (bVar88 != 0) {
                  auVar165._0_4_ = auVar99._0_4_ * fVar166;
                  auVar165._4_4_ = auVar99._4_4_ * fVar150;
                  auVar165._8_4_ = auVar99._8_4_ * fVar163;
                  auVar165._12_4_ = auVar99._12_4_ * fVar164;
                  auVar165._16_4_ = auVar99._16_4_ * 0.0;
                  auVar165._20_4_ = auVar99._20_4_ * 0.0;
                  auVar165._24_4_ = auVar99._24_4_ * 0.0;
                  auVar165._28_4_ = 0;
                  auVar186._8_4_ = 0x3f800000;
                  auVar186._0_8_ = 0x3f8000003f800000;
                  auVar186._12_4_ = 0x3f800000;
                  auVar186._16_4_ = 0x3f800000;
                  auVar186._20_4_ = 0x3f800000;
                  auVar186._24_4_ = 0x3f800000;
                  auVar186._28_4_ = 0x3f800000;
                  auVar104 = vsubps_avx(auVar186,auVar165);
                  auVar138._0_4_ =
                       (uint)(bVar79 & 1) * (int)auVar165._0_4_ |
                       (uint)!(bool)(bVar79 & 1) * auVar104._0_4_;
                  bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
                  auVar138._4_4_ =
                       (uint)bVar17 * (int)auVar165._4_4_ | (uint)!bVar17 * auVar104._4_4_;
                  bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
                  auVar138._8_4_ =
                       (uint)bVar17 * (int)auVar165._8_4_ | (uint)!bVar17 * auVar104._8_4_;
                  bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
                  auVar138._12_4_ =
                       (uint)bVar17 * (int)auVar165._12_4_ | (uint)!bVar17 * auVar104._12_4_;
                  bVar17 = (bool)((byte)(uVar80 >> 4) & 1);
                  auVar138._16_4_ =
                       (uint)bVar17 * (int)auVar165._16_4_ | (uint)!bVar17 * auVar104._16_4_;
                  bVar17 = (bool)((byte)(uVar80 >> 5) & 1);
                  auVar138._20_4_ =
                       (uint)bVar17 * (int)auVar165._20_4_ | (uint)!bVar17 * auVar104._20_4_;
                  bVar17 = (bool)((byte)(uVar80 >> 6) & 1);
                  auVar138._24_4_ =
                       (uint)bVar17 * (int)auVar165._24_4_ | (uint)!bVar17 * auVar104._24_4_;
                  auVar138._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar104._28_4_;
                  auVar37._8_4_ = 0x40000000;
                  auVar37._0_8_ = 0x4000000040000000;
                  auVar37._12_4_ = 0x40000000;
                  auVar37._16_4_ = 0x40000000;
                  auVar37._20_4_ = 0x40000000;
                  auVar37._24_4_ = 0x40000000;
                  auVar37._28_4_ = 0x40000000;
                  local_260 = vfmsub132ps_avx512vl(auVar138,auVar186,auVar37);
                  local_220 = (int)lVar82;
                  local_21c = iVar14;
                  auVar206 = ZEXT1664(local_5a0);
                  local_210 = local_5a0;
                  local_200 = uVar23;
                  uStack_1f8 = uVar26;
                  local_1f0 = uVar73;
                  uStack_1e8 = uVar74;
                  local_1e0 = uVar75;
                  uStack_1d8 = uVar76;
                  pGVar83 = (context->scene->geometries).items[uVar13].ptr;
                  if ((pGVar83->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    uVar87 = (uint)uVar86;
                    auVar96 = vcvtsi2ss_avx512f(auVar98,(int)lVar82);
                    fVar166 = auVar96._0_4_;
                    local_1c0[0] = (fVar166 + local_280._0_4_ + 0.0) * local_120;
                    local_1c0[1] = (fVar166 + local_280._4_4_ + 1.0) * fStack_11c;
                    local_1c0[2] = (fVar166 + local_280._8_4_ + 2.0) * fStack_118;
                    local_1c0[3] = (fVar166 + local_280._12_4_ + 3.0) * fStack_114;
                    fStack_1b0 = (fVar166 + local_280._16_4_ + 4.0) * fStack_110;
                    fStack_1ac = (fVar166 + local_280._20_4_ + 5.0) * fStack_10c;
                    fStack_1a8 = (fVar166 + local_280._24_4_ + 6.0) * fStack_108;
                    fStack_1a4 = fVar166 + local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    auVar158._8_4_ = 0x7f800000;
                    auVar158._0_8_ = 0x7f8000007f800000;
                    auVar158._12_4_ = 0x7f800000;
                    auVar158._16_4_ = 0x7f800000;
                    auVar158._20_4_ = 0x7f800000;
                    auVar158._24_4_ = 0x7f800000;
                    auVar158._28_4_ = 0x7f800000;
                    auVar104 = vblendmps_avx512vl(auVar158,local_240);
                    auVar139._0_4_ =
                         (uint)(bVar88 & 1) * auVar104._0_4_ |
                         (uint)!(bool)(bVar88 & 1) * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
                    auVar139._4_4_ = (uint)bVar17 * auVar104._4_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
                    auVar139._8_4_ = (uint)bVar17 * auVar104._8_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar86 >> 3) & 1);
                    auVar139._12_4_ = (uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar86 >> 4) & 1);
                    auVar139._16_4_ = (uint)bVar17 * auVar104._16_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar86 >> 5) & 1);
                    auVar139._20_4_ = (uint)bVar17 * auVar104._20_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = (bool)((byte)(uVar86 >> 6) & 1);
                    auVar139._24_4_ = (uint)bVar17 * auVar104._24_4_ | (uint)!bVar17 * 0x7f800000;
                    bVar17 = SUB81(uVar86 >> 7,0);
                    auVar139._28_4_ = (uint)bVar17 * auVar104._28_4_ | (uint)!bVar17 * 0x7f800000;
                    auVar104 = vshufps_avx(auVar139,auVar139,0xb1);
                    auVar104 = vminps_avx(auVar139,auVar104);
                    auVar102 = vshufpd_avx(auVar104,auVar104,5);
                    auVar104 = vminps_avx(auVar104,auVar102);
                    auVar102 = vpermpd_avx2(auVar104,0x4e);
                    auVar104 = vminps_avx(auVar104,auVar102);
                    uVar24 = vcmpps_avx512vl(auVar139,auVar104,0);
                    if ((bVar88 & (byte)uVar24) != 0) {
                      uVar87 = (uint)(bVar88 & (byte)uVar24);
                    }
                    uVar81 = 0;
                    for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                      uVar81 = uVar81 + 1;
                    }
                    uVar80 = (ulong)uVar81;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_140 = vmovdqa64_avx512vl(auVar218._0_32_);
                      local_560 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                      local_520._0_8_ = pGVar83;
                      local_500 = local_240;
                      do {
                        fVar166 = local_1c0[uVar80];
                        local_3e0._4_4_ = fVar166;
                        local_3e0._0_4_ = fVar166;
                        local_3e0._8_4_ = fVar166;
                        local_3e0._12_4_ = fVar166;
                        local_3d0 = *(undefined4 *)(local_1a0 + uVar80 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_180 + uVar80 * 4);
                        local_590.context = context->user;
                        fVar150 = 1.0 - fVar166;
                        auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar166 * (fVar150 + fVar150))),
                                                  ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                        auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3e0,
                                                  ZEXT416(0xc0a00000));
                        auVar152 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166 * 3.0)),
                                                   ZEXT416((uint)(fVar166 + fVar166)),auVar96);
                        auVar201 = ZEXT1664(auVar152);
                        auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_3e0,
                                                  ZEXT416(0x40000000));
                        auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * -3.0)),
                                                  ZEXT416((uint)(fVar150 + fVar150)),auVar96);
                        auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),local_3e0,
                                                  ZEXT416((uint)(fVar150 * -2.0)));
                        fVar166 = auVar8._0_4_ * 0.5;
                        fVar150 = auVar152._0_4_ * 0.5;
                        fVar163 = auVar96._0_4_ * 0.5;
                        fVar164 = auVar97._0_4_ * 0.5;
                        auVar180._0_4_ = fVar164 * local_600;
                        auVar180._4_4_ = fVar164 * fStack_5fc;
                        auVar180._8_4_ = fVar164 * fStack_5f8;
                        auVar180._12_4_ = fVar164 * fStack_5f4;
                        auVar196._4_4_ = fVar163;
                        auVar196._0_4_ = fVar163;
                        auVar196._8_4_ = fVar163;
                        auVar196._12_4_ = fVar163;
                        auVar96 = vfmadd132ps_fma(auVar196,auVar180,auVar11);
                        auVar199 = ZEXT1664(auVar96);
                        auVar181._4_4_ = fVar150;
                        auVar181._0_4_ = fVar150;
                        auVar181._8_4_ = fVar150;
                        auVar181._12_4_ = fVar150;
                        auVar97 = vfmadd132ps_fma(auVar181,auVar96,auVar12);
                        auVar153._4_4_ = fVar166;
                        auVar153._0_4_ = fVar166;
                        auVar153._8_4_ = fVar166;
                        auVar153._12_4_ = fVar166;
                        auVar97 = vfmadd213ps_fma(auVar153,auVar206._0_16_,auVar97);
                        local_410 = auVar97._0_4_;
                        local_400 = vshufps_avx(auVar97,auVar97,0x55);
                        auVar193 = ZEXT1664(local_400);
                        local_3f0 = vshufps_avx(auVar97,auVar97,0xaa);
                        iStack_40c = local_410;
                        iStack_408 = local_410;
                        iStack_404 = local_410;
                        uStack_3cc = local_3d0;
                        uStack_3c8 = local_3d0;
                        uStack_3c4 = local_3d0;
                        local_3c0 = local_4c0._0_8_;
                        uStack_3b8 = local_4c0._8_8_;
                        local_3b0 = local_4b0;
                        vpcmpeqd_avx2(ZEXT1632(local_4b0),ZEXT1632(local_4b0));
                        uStack_39c = (local_590.context)->instID[0];
                        local_3a0 = uStack_39c;
                        uStack_398 = uStack_39c;
                        uStack_394 = uStack_39c;
                        uStack_390 = (local_590.context)->instPrimID[0];
                        uStack_38c = uStack_390;
                        uStack_388 = uStack_390;
                        uStack_384 = uStack_390;
                        local_5d0 = local_4d0;
                        local_590.valid = (int *)local_5d0;
                        local_590.geometryUserPtr = pGVar83->userPtr;
                        local_590.hit = (RTCHitN *)&local_410;
                        local_590.N = 4;
                        local_590.ray = (RTCRayN *)ray;
                        if (pGVar83->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar193 = ZEXT1664(local_400);
                          auVar199 = ZEXT1664(auVar96);
                          auVar201 = ZEXT1664(auVar152);
                          (*pGVar83->intersectionFilterN)(&local_590);
                          auVar208 = ZEXT3264(local_500);
                          auVar206 = ZEXT1664(local_5a0);
                          pGVar83 = (Geometry *)local_520._0_8_;
                        }
                        uVar89 = vptestmd_avx512vl(local_5d0,local_5d0);
                        if ((uVar89 & 0xf) == 0) {
LAB_01a536d1:
                          *(undefined4 *)(ray + k * 4 + 0x80) = local_560._0_4_;
                        }
                        else {
                          p_Var16 = context->args->filter;
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar83->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar193 = ZEXT1664(auVar193._0_16_);
                            auVar199 = ZEXT1664(auVar199._0_16_);
                            auVar201 = ZEXT1664(auVar201._0_16_);
                            (*p_Var16)(&local_590);
                            auVar208 = ZEXT3264(local_500);
                            auVar206 = ZEXT1664(local_5a0);
                            pGVar83 = (Geometry *)local_520._0_8_;
                          }
                          uVar89 = vptestmd_avx512vl(local_5d0,local_5d0);
                          uVar89 = uVar89 & 0xf;
                          bVar88 = (byte)uVar89;
                          if (bVar88 == 0) goto LAB_01a536d1;
                          iVar1 = *(int *)(local_590.hit + 4);
                          iVar2 = *(int *)(local_590.hit + 8);
                          iVar72 = *(int *)(local_590.hit + 0xc);
                          bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                          bVar19 = SUB81(uVar89 >> 3,0);
                          *(uint *)(local_590.ray + 0xc0) =
                               (uint)(bVar88 & 1) * *(int *)local_590.hit |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0xc0);
                          *(uint *)(local_590.ray + 0xc4) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xc4)
                          ;
                          *(uint *)(local_590.ray + 200) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 200);
                          *(uint *)(local_590.ray + 0xcc) =
                               (uint)bVar19 * iVar72 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0xcc);
                          iVar1 = *(int *)(local_590.hit + 0x14);
                          iVar2 = *(int *)(local_590.hit + 0x18);
                          iVar72 = *(int *)(local_590.hit + 0x1c);
                          bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                          bVar19 = SUB81(uVar89 >> 3,0);
                          *(uint *)(local_590.ray + 0xd0) =
                               (uint)(bVar88 & 1) * *(int *)(local_590.hit + 0x10) |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0xd0);
                          *(uint *)(local_590.ray + 0xd4) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xd4)
                          ;
                          *(uint *)(local_590.ray + 0xd8) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xd8)
                          ;
                          *(uint *)(local_590.ray + 0xdc) =
                               (uint)bVar19 * iVar72 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0xdc);
                          iVar1 = *(int *)(local_590.hit + 0x24);
                          iVar2 = *(int *)(local_590.hit + 0x28);
                          iVar72 = *(int *)(local_590.hit + 0x2c);
                          bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                          bVar19 = SUB81(uVar89 >> 3,0);
                          *(uint *)(local_590.ray + 0xe0) =
                               (uint)(bVar88 & 1) * *(int *)(local_590.hit + 0x20) |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0xe0);
                          *(uint *)(local_590.ray + 0xe4) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xe4)
                          ;
                          *(uint *)(local_590.ray + 0xe8) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xe8)
                          ;
                          *(uint *)(local_590.ray + 0xec) =
                               (uint)bVar19 * iVar72 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0xec);
                          iVar1 = *(int *)(local_590.hit + 0x34);
                          iVar2 = *(int *)(local_590.hit + 0x38);
                          iVar72 = *(int *)(local_590.hit + 0x3c);
                          bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                          bVar19 = SUB81(uVar89 >> 3,0);
                          *(uint *)(local_590.ray + 0xf0) =
                               (uint)(bVar88 & 1) * *(int *)(local_590.hit + 0x30) |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0xf0);
                          *(uint *)(local_590.ray + 0xf4) =
                               (uint)bVar17 * iVar1 | (uint)!bVar17 * *(int *)(local_590.ray + 0xf4)
                          ;
                          *(uint *)(local_590.ray + 0xf8) =
                               (uint)bVar18 * iVar2 | (uint)!bVar18 * *(int *)(local_590.ray + 0xf8)
                          ;
                          *(uint *)(local_590.ray + 0xfc) =
                               (uint)bVar19 * iVar72 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0xfc);
                          iVar1 = *(int *)(local_590.hit + 0x44);
                          iVar2 = *(int *)(local_590.hit + 0x48);
                          iVar72 = *(int *)(local_590.hit + 0x4c);
                          bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
                          bVar18 = (bool)((byte)(uVar89 >> 2) & 1);
                          bVar19 = SUB81(uVar89 >> 3,0);
                          *(uint *)(local_590.ray + 0x100) =
                               (uint)(bVar88 & 1) * *(int *)(local_590.hit + 0x40) |
                               (uint)!(bool)(bVar88 & 1) * *(int *)(local_590.ray + 0x100);
                          *(uint *)(local_590.ray + 0x104) =
                               (uint)bVar17 * iVar1 |
                               (uint)!bVar17 * *(int *)(local_590.ray + 0x104);
                          *(uint *)(local_590.ray + 0x108) =
                               (uint)bVar18 * iVar2 |
                               (uint)!bVar18 * *(int *)(local_590.ray + 0x108);
                          *(uint *)(local_590.ray + 0x10c) =
                               (uint)bVar19 * iVar72 |
                               (uint)!bVar19 * *(int *)(local_590.ray + 0x10c);
                          auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar96;
                          auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar96;
                          auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar96;
                          auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar96;
                          local_560._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                          local_560._4_4_ = 0;
                          local_560._8_4_ = 0;
                          local_560._12_4_ = 0;
                        }
                        bVar88 = ~(byte)(1 << ((uint)uVar80 & 0x1f)) & (byte)uVar86;
                        auVar159._4_4_ = local_560._0_4_;
                        auVar159._0_4_ = local_560._0_4_;
                        auVar159._8_4_ = local_560._0_4_;
                        auVar159._12_4_ = local_560._0_4_;
                        auVar159._16_4_ = local_560._0_4_;
                        auVar159._20_4_ = local_560._0_4_;
                        auVar159._24_4_ = local_560._0_4_;
                        auVar159._28_4_ = local_560._0_4_;
                        uVar24 = vcmpps_avx512vl(auVar208._0_32_,auVar159,2);
                        if ((bVar88 & (byte)uVar24) == 0) goto LAB_01a5376e;
                        bVar88 = bVar88 & (byte)uVar24;
                        uVar87 = (uint)bVar88;
                        uVar86 = (ulong)uVar87;
                        auVar160._8_4_ = 0x7f800000;
                        auVar160._0_8_ = 0x7f8000007f800000;
                        auVar160._12_4_ = 0x7f800000;
                        auVar160._16_4_ = 0x7f800000;
                        auVar160._20_4_ = 0x7f800000;
                        auVar160._24_4_ = 0x7f800000;
                        auVar160._28_4_ = 0x7f800000;
                        auVar104 = vblendmps_avx512vl(auVar160,auVar208._0_32_);
                        auVar140._0_4_ =
                             (uint)(bVar88 & 1) * auVar104._0_4_ |
                             (uint)!(bool)(bVar88 & 1) * 0x7f800000;
                        bVar17 = (bool)(bVar88 >> 1 & 1);
                        auVar140._4_4_ = (uint)bVar17 * auVar104._4_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar88 >> 2 & 1);
                        auVar140._8_4_ = (uint)bVar17 * auVar104._8_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar88 >> 3 & 1);
                        auVar140._12_4_ =
                             (uint)bVar17 * auVar104._12_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar88 >> 4 & 1);
                        auVar140._16_4_ =
                             (uint)bVar17 * auVar104._16_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar88 >> 5 & 1);
                        auVar140._20_4_ =
                             (uint)bVar17 * auVar104._20_4_ | (uint)!bVar17 * 0x7f800000;
                        bVar17 = (bool)(bVar88 >> 6 & 1);
                        auVar140._24_4_ =
                             (uint)bVar17 * auVar104._24_4_ | (uint)!bVar17 * 0x7f800000;
                        auVar140._28_4_ =
                             (uint)(bVar88 >> 7) * auVar104._28_4_ |
                             (uint)!(bool)(bVar88 >> 7) * 0x7f800000;
                        auVar104 = vshufps_avx(auVar140,auVar140,0xb1);
                        auVar104 = vminps_avx(auVar140,auVar104);
                        auVar102 = vshufpd_avx(auVar104,auVar104,5);
                        auVar104 = vminps_avx(auVar104,auVar102);
                        auVar102 = vpermpd_avx2(auVar104,0x4e);
                        auVar104 = vminps_avx(auVar104,auVar102);
                        uVar24 = vcmpps_avx512vl(auVar140,auVar104,0);
                        bVar88 = (byte)uVar24 & bVar88;
                        if (bVar88 != 0) {
                          uVar87 = (uint)bVar88;
                        }
                        uVar81 = 0;
                        for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                          uVar81 = uVar81 + 1;
                        }
                        uVar80 = (ulong)uVar81;
                      } while( true );
                    }
                    fVar166 = local_1c0[uVar80];
                    uVar151 = *(undefined4 *)(local_1a0 + uVar80 * 4);
                    fVar150 = 1.0 - fVar166;
                    auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar166 * (fVar150 + fVar150))),
                                              ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                    auVar152 = ZEXT416((uint)fVar166);
                    auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar152,
                                              ZEXT416(0xc0a00000));
                    auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166 * 3.0)),
                                              ZEXT416((uint)(fVar166 + fVar166)),auVar96);
                    auVar201 = ZEXT1664(auVar97);
                    auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar152,
                                              ZEXT416(0x40000000));
                    auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar150 * fVar150 * -3.0)),
                                              ZEXT416((uint)(fVar150 + fVar150)),auVar96);
                    auVar152 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),auVar152,
                                               ZEXT416((uint)(fVar150 * -2.0)));
                    fVar150 = auVar8._0_4_ * 0.5;
                    fVar163 = auVar97._0_4_ * 0.5;
                    auVar193 = ZEXT464((uint)fVar163);
                    fVar164 = auVar96._0_4_ * 0.5;
                    fVar173 = auVar152._0_4_ * 0.5;
                    auVar178._0_4_ = fVar173 * local_600;
                    auVar178._4_4_ = fVar173 * fStack_5fc;
                    auVar178._8_4_ = fVar173 * fStack_5f8;
                    auVar178._12_4_ = fVar173 * fStack_5f4;
                    auVar195._4_4_ = fVar164;
                    auVar195._0_4_ = fVar164;
                    auVar195._8_4_ = fVar164;
                    auVar195._12_4_ = fVar164;
                    auVar96 = vfmadd132ps_fma(auVar195,auVar178,auVar9);
                    auVar199 = ZEXT1664(auVar96);
                    auVar179._4_4_ = fVar163;
                    auVar179._0_4_ = fVar163;
                    auVar179._8_4_ = fVar163;
                    auVar179._12_4_ = fVar163;
                    auVar96 = vfmadd132ps_fma(auVar179,auVar96,auVar10);
                    auVar168._4_4_ = fVar150;
                    auVar168._0_4_ = fVar150;
                    auVar168._8_4_ = fVar150;
                    auVar168._12_4_ = fVar150;
                    auVar96 = vfmadd213ps_fma(auVar168,local_5a0,auVar96);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar80 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar96._0_4_;
                    uVar15 = vextractps_avx(auVar96,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar15;
                    uVar15 = vextractps_avx(auVar96,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar15;
                    *(float *)(ray + k * 4 + 0xf0) = fVar166;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar151;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_5a8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar13;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01a53382;
      }
    }
    uVar151 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar33._4_4_ = uVar151;
    auVar33._0_4_ = uVar151;
    auVar33._8_4_ = uVar151;
    auVar33._12_4_ = uVar151;
    auVar33._16_4_ = uVar151;
    auVar33._20_4_ = uVar151;
    auVar33._24_4_ = uVar151;
    auVar33._28_4_ = uVar151;
    uVar23 = vcmpps_avx512vl(local_80,auVar33,2);
    uVar85 = (ulong)((uint)uVar85 & (uint)uVar23);
  } while( true );
LAB_01a5376e:
  auVar217 = ZEXT3264(local_480);
  auVar219 = ZEXT3264(local_4a0);
  auVar104 = vmovdqa64_avx512vl(local_140);
  auVar218 = ZEXT3264(auVar104);
  pre = local_5b8;
  prim = local_5b0;
LAB_01a53382:
  lVar82 = lVar82 + 8;
  goto LAB_01a52a8c;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }